

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests_impl.h
# Opt level: O3

void run_schnorrsig_tests(void)

{
  byte *pbVar1;
  MUSIG_ERROR MVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  size_t n_sigs;
  undefined1 auVar9 [16];
  bool bVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  bool bVar13;
  int iVar14;
  uint32_t uVar15;
  uint32_t uVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  long lVar20;
  undefined8 *puVar21;
  ulong uVar22;
  uchar *extra_input32;
  long lVar23;
  size_t in_RCX;
  secp256k1_keyagg_cache_internal *psVar24;
  secp256k1_keypair *keypair;
  uchar *msg32;
  ulong uVar25;
  secp256k1_fe *a;
  uint uVar26;
  secp256k1_context *extraparams;
  secp256k1_pubkey *psVar28;
  secp256k1_keyagg_cache_internal *psVar29;
  secp256k1_musig_keyagg_cache *cache;
  bool bVar30;
  code *unaff_RBP;
  secp256k1_pubkey **ppsVar31;
  secp256k1_scalar *r;
  undefined1 *puVar32;
  uchar *puVar33;
  secp256k1_keyagg_cache_internal *psVar34;
  secp256k1_keyagg_cache_internal *psVar35;
  ulong uVar36;
  secp256k1_keyagg_cache_internal *psVar37;
  size_t in_R8;
  long *plVar38;
  secp256k1_schnorrsig_extraparams *pubkey;
  secp256k1_musig_pubnonce *psVar39;
  long lVar40;
  secp256k1_schnorrsig_extraparams *psVar41;
  code *msg_00;
  uint64_t uVar42;
  long lVar43;
  size_t sVar44;
  code *keypair_00;
  secp256k1_schnorrsig_extraparams *psVar45;
  secp256k1_musig_pubnonce **ppsVar46;
  byte bVar47;
  ulong uVar48;
  int32_t _calls_to_callback;
  secp256k1_callback _saved_callback;
  uchar aux_rand [32];
  uchar algo [13];
  uchar nonce_z [32];
  uchar *args [5];
  uchar key [32];
  uchar pk [32];
  uchar msg [32];
  uchar nonce [32];
  secp256k1_xonly_pubkey pk_1 [3];
  secp256k1_sha256 sha;
  secp256k1_schnorrsig_extraparams invalid_extraparams;
  undefined1 auStack_db0 [80];
  uint64_t uStack_d60;
  ulong uStack_d58;
  secp256k1_keyagg_cache_internal *psStack_d50;
  secp256k1_keyagg_cache_internal *psStack_d48;
  undefined1 auStack_d40 [8];
  undefined1 auStack_d38 [8];
  undefined1 auStack_d30 [8];
  secp256k1_pubkey *psStack_d28;
  secp256k1_musig_pubnonce *psStack_d20;
  secp256k1_musig_pubnonce *psStack_d18;
  undefined1 auStack_d10 [144];
  undefined1 auStack_c80 [176];
  uchar auStack_bd0 [32];
  undefined1 auStack_bb0 [128];
  undefined1 auStack_b30 [208];
  undefined1 auStack_a60 [96];
  undefined1 auStack_a00 [96];
  undefined1 auStack_9a0 [96];
  undefined1 auStack_940 [36];
  undefined1 auStack_91c [28];
  undefined1 auStack_900 [68];
  undefined1 auStack_8bc [124];
  secp256k1_scalar asStack_840 [2];
  secp256k1_scalar asStack_800 [6];
  secp256k1_xonly_pubkey sStack_740;
  undefined1 auStack_700 [96];
  uint64_t uStack_6a0;
  secp256k1_keyagg_cache_internal sStack_67c;
  uchar auStack_480 [72];
  secp256k1_context *psStack_438;
  secp256k1_schnorrsig_extraparams *psStack_430;
  secp256k1_schnorrsig_extraparams *psStack_428;
  secp256k1_schnorrsig_extraparams *psStack_420;
  secp256k1_schnorrsig_extraparams *psStack_418;
  secp256k1_schnorrsig_extraparams *psStack_410;
  undefined1 local_3ec [12];
  void *pvStack_3e0;
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [16];
  secp256k1_schnorrsig_extraparams local_3b8;
  undefined1 local_398 [64];
  undefined1 local_358 [8];
  secp256k1_schnorrsig_extraparams *psStack_350;
  secp256k1_nonce_function_hardened *local_348;
  secp256k1_schnorrsig_extraparams *psStack_340;
  secp256k1_context *local_338;
  uint64_t uStack_330;
  undefined1 local_328 [16];
  secp256k1_callback local_318;
  secp256k1_callback local_308;
  secp256k1_schnorrsig_extraparams local_2f8;
  undefined8 uStack_2e0;
  secp256k1_nonce_function_hardened local_2d8 [4];
  undefined1 local_2b8 [48];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_228 [40];
  uint64_t uStack_200;
  _func_void_char_ptr_void_ptr *local_1f8;
  void *pvStack_1f0;
  secp256k1_xonly_pubkey local_1e8;
  secp256k1_xonly_pubkey local_1a8;
  undefined1 local_168 [192];
  undefined1 local_a8 [96];
  secp256k1_schnorrsig_extraparams local_48;
  secp256k1_context *psVar27;
  secp256k1_schnorrsig_extraparams *pubkey_00;
  
  uStack_330 = (uint64_t)local_338;
  psVar41 = &local_3b8;
  local_3b8.noncefp._0_4_ = 0x636e6f6e;
  local_3b8.noncefp._4_1_ = 0x65;
  builtin_memcpy(local_3b8.magic,"BIP0",4);
  local_3b8._4_4_ = 0x2f303433;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x143475;
  secp256k1_sha256_initialize_tagged((secp256k1_sha256 *)local_168,"BIP0340/nonce",0xd);
  local_228._0_8_ = 0xf4bfbff746615b35;
  local_228._8_8_ = (secp256k1_nonce_function_hardened)0x83627ab39f8dc671;
  local_228._16_8_ = (void *)0x5735866160217180;
  local_228._24_8_ = 0x68b07b4c21a29e54;
  local_1e8.data[0x20] = '@';
  local_1e8.data[0x21] = '\0';
  local_1e8.data[0x22] = '\0';
  local_1e8.data[0x23] = '\0';
  local_1e8.data[0x24] = '\0';
  local_1e8.data[0x25] = '\0';
  local_1e8.data[0x26] = '\0';
  local_1e8.data[0x27] = '\0';
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1434a9;
  test_sha256_eq((secp256k1_sha256 *)local_168,(secp256k1_sha256 *)local_228);
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1434bd;
  secp256k1_sha256_initialize_tagged((secp256k1_sha256 *)local_168,"BIP0340/auxBIP0340/nonce",0xb);
  local_228._0_8_ = 0x4eba7e7024dd3219;
  local_228._8_8_ = (secp256k1_nonce_function_hardened)0xfa3166dca0fabb9;
  local_228._16_8_ = (void *)0x4c44df973afbe4b1;
  local_228._24_8_ = 0x249e850a4aac2739;
  local_1e8.data[0x20] = '@';
  local_1e8.data[0x21] = '\0';
  local_1e8.data[0x22] = '\0';
  local_1e8.data[0x23] = '\0';
  local_1e8.data[0x24] = '\0';
  local_1e8.data[0x25] = '\0';
  local_1e8.data[0x26] = '\0';
  local_1e8.data[0x27] = '\0';
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1434e5;
  test_sha256_eq((secp256k1_sha256 *)local_168,(secp256k1_sha256 *)local_228);
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1434f5;
  testrand256((uchar *)local_2b8);
  pubkey_00 = &local_2f8;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x143505;
  testrand256(pubkey_00->magic);
  pubkey = (secp256k1_schnorrsig_extraparams *)&(&local_2f8)[1].noncefp;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x143515;
  testrand256((uchar *)pubkey);
  psVar27 = (secp256k1_context *)local_3d8;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x143522;
  testrand256((uchar *)psVar27);
  keypair_00 = (code *)local_2b8;
  local_348 = (secp256k1_nonce_function_hardened *)pubkey;
  psStack_340 = psVar41;
  local_358 = (undefined1  [8])local_2b8;
  psStack_350 = pubkey_00;
  local_338 = psVar27;
  if (0 < COUNT) {
    keypair_00 = (code *)local_358;
    psVar27 = (secp256k1_context *)0x0;
    do {
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x14356c;
      nonce_function_bip340_bitflip((uchar **)keypair_00,0,0x20,in_RCX,in_R8);
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x14357e;
      nonce_function_bip340_bitflip((uchar **)keypair_00,1,0x20,in_RCX,in_R8);
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x143590;
      nonce_function_bip340_bitflip((uchar **)keypair_00,2,0x20,in_RCX,in_R8);
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1435a2;
      nonce_function_bip340_bitflip((uchar **)keypair_00,3,0xd,in_RCX,in_R8);
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1435b4;
      nonce_function_bip340_bitflip((uchar **)keypair_00,3,0xd,in_RCX,in_R8);
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1435c6;
      nonce_function_bip340_bitflip((uchar **)keypair_00,4,0x20,in_RCX,in_R8);
      uVar26 = (int)psVar27 + 1;
      psVar27 = (secp256k1_context *)(ulong)uVar26;
    } while ((int)uVar26 < COUNT);
  }
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x143610;
  iVar14 = nonce_function_bip340
                     (local_288,local_2b8,0x20,local_2f8.magic,(uchar *)&(&local_2f8)[1].noncefp,
                      local_3b8.magic,0xd,(void *)0x0);
  if (iVar14 == 0) goto LAB_00145a19;
  keypair_00 = (code *)&local_3b8;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x14362a;
  testrand_bytes_test((uchar *)keypair_00,0xd);
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x143668;
  iVar14 = nonce_function_bip340
                     (local_288,local_2b8,0x20,local_2f8.magic,(uchar *)&(&local_2f8)[1].noncefp,
                      (uchar *)keypair_00,0xd,(void *)0x0);
  if (iVar14 == 0) goto LAB_00145a1e;
  if (0 < COUNT) {
    psVar27 = (secp256k1_context *)0x0;
    keypair_00 = (code *)local_398;
    pubkey_00 = (secp256k1_schnorrsig_extraparams *)local_2b8;
    pubkey = &local_2f8;
    psVar41 = (secp256k1_schnorrsig_extraparams *)&(&local_2f8)[1].noncefp;
    unaff_RBP = (code *)&local_3b8;
    do {
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1436ab;
      uVar15 = testrand_int(0x1f);
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1436d6;
      iVar14 = nonce_function_bip340
                         ((uchar *)keypair_00,(uchar *)pubkey_00,(ulong)(uVar15 & 0x1f),
                          pubkey->magic,(uchar *)psVar41,(uchar *)unaff_RBP,0xd,(void *)0x0);
      if (iVar14 == 0) goto LAB_0014596f;
      lVar20 = 0;
      while (local_288[lVar20] == local_398[lVar20]) {
        lVar20 = lVar20 + 1;
        if (lVar20 == 0x20) goto LAB_00145a0f;
      }
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x143705;
      uVar15 = testrand_int(0xc);
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x14374c;
      iVar14 = nonce_function_bip340
                         ((uchar *)keypair_00,(uchar *)pubkey_00,0x20,pubkey->magic,(uchar *)psVar41
                          ,(uchar *)unaff_RBP,((ulong)uVar15 + 0xd) % 0xd,(void *)0x0);
      extraparams = psVar27;
      if (iVar14 == 0) goto LAB_00145974;
      lVar20 = 0;
      while (local_288[lVar20] == local_398[lVar20]) {
        lVar20 = lVar20 + 1;
        if (lVar20 == 0x20) goto LAB_00145a14;
      }
      uVar26 = (int)psVar27 + 1;
      psVar27 = (secp256k1_context *)(ulong)uVar26;
    } while ((int)uVar26 < COUNT);
  }
  local_3c8 = (undefined1  [16])0x0;
  local_3d8 = (undefined1  [16])0x0;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1437cd;
  iVar14 = nonce_function_bip340
                     (local_398,local_2b8,0x20,local_2f8.magic,(uchar *)&(&local_2f8)[1].noncefp,
                      local_3b8.magic,0xd,local_3d8);
  if (iVar14 == 0) goto LAB_00145a23;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x143815;
  iVar14 = nonce_function_bip340
                     (local_288,local_2b8,0x20,local_2f8.magic,(uchar *)&(&local_2f8)[1].noncefp,
                      local_3b8.magic,0xd,(void *)0x0);
  extraparams = psVar27;
  if (iVar14 == 0) goto LAB_00145a28;
  lVar20 = 0;
  do {
    if (local_398[lVar20] != local_288[lVar20]) goto LAB_00145ba9;
    lVar20 = lVar20 + 1;
  } while (lVar20 != 0x20);
  local_308.fn = (_func_void_char_ptr_void_ptr *)0x0;
  local_308.data = (void *)0x0;
  local_318.fn = (_func_void_char_ptr_void_ptr *)0x0;
  local_318.data = (void *)0x0;
  local_328 = (undefined1  [16])0x0;
  local_338 = (secp256k1_context *)0x0;
  uStack_330 = 0;
  local_348 = (secp256k1_nonce_function_hardened *)0x0;
  psStack_340 = (secp256k1_schnorrsig_extraparams *)0x0;
  local_358 = (undefined1  [8])0x0;
  psStack_350 = (secp256k1_schnorrsig_extraparams *)0x0;
  local_3b8.ndata = (void *)0x0;
  local_3b8.magic[0] = 0xda;
  local_3b8.magic[1] = 'o';
  local_3b8.magic[2] = 0xb3;
  local_3b8.magic[3] = 0x8c;
  local_3b8._4_4_ = 0;
  local_3b8.noncefp._0_4_ = 0;
  local_3b8.noncefp._4_1_ = 0;
  local_3b8.noncefp._5_3_ = 0;
  local_48.magic[0] = '\0';
  local_48.magic[1] = '\0';
  local_48.magic[2] = '\0';
  local_48.magic[3] = '\0';
  local_48._4_4_ = 0;
  local_48.noncefp = (secp256k1_nonce_function_hardened)0x0;
  local_48.ndata = (void *)0x0;
  extraparams = (secp256k1_context *)local_2b8;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1438b0;
  testrand256((uchar *)extraparams);
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1438bd;
  testrand256(local_2f8.magic);
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1438ca;
  testrand256((uchar *)&(&local_2f8)[1].noncefp);
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1438d4;
  testrand256(local_3d8);
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1438eb;
  iVar14 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)local_168,(uchar *)extraparams);
  if (iVar14 == 0) goto LAB_00145a2d;
  keypair_00 = (code *)(local_168 + 0x60);
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x143912;
  iVar14 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)keypair_00,local_2f8.magic);
  if (iVar14 == 0) goto LAB_00145a32;
  extraparams = (secp256k1_context *)(local_168 + 0xc0);
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x143939;
  iVar14 = secp256k1_keypair_create
                     (CTX,(secp256k1_keypair *)extraparams,(uchar *)&(&local_2f8)[1].noncefp);
  if (iVar14 == 0) goto LAB_00145a37;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x14395f;
  iVar14 = secp256k1_keypair_xonly_pub
                     (CTX,(secp256k1_xonly_pubkey *)local_228,(int *)0x0,
                      (secp256k1_keypair *)local_168);
  if (iVar14 == 0) goto LAB_00145a3c;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x143980;
  iVar14 = secp256k1_keypair_xonly_pub(CTX,&local_1e8,(int *)0x0,(secp256k1_keypair *)keypair_00);
  if (iVar14 == 0) goto LAB_00145a41;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1439a1;
  iVar14 = secp256k1_keypair_xonly_pub(CTX,&local_1a8,(int *)0x0,(secp256k1_keypair *)extraparams);
  if (iVar14 == 0) goto LAB_00145a46;
  local_258 = (undefined1  [16])0x0;
  local_268 = (undefined1  [16])0x0;
  local_278 = (undefined1  [16])0x0;
  local_288 = (undefined1  [16])0x0;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x143a03;
  iVar14 = secp256k1_schnorrsig_sign_internal
                     (CTX,local_398,local_3d8,0x20,(secp256k1_keypair *)local_168,
                      nonce_function_bip340,(void *)0x0);
  psVar27 = CTX;
  if (iVar14 == 0) goto LAB_00145a4b;
  local_3ec[0] = '\0';
  local_3ec[1] = '\0';
  local_3ec[2] = '\0';
  local_3ec[3] = '\0';
  local_3ec._4_8_ = (CTX->illegal_callback).fn;
  pvStack_3e0 = (CTX->illegal_callback).data;
  extraparams = &secp256k1_context_static_;
  if (CTX == &secp256k1_context_static_) goto LAB_00145a50;
  keypair_00 = counting_callback_fn;
  (CTX->illegal_callback).fn = counting_callback_fn;
  pubkey_00 = (secp256k1_schnorrsig_extraparams *)local_3ec;
  (psVar27->illegal_callback).data = pubkey_00;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x143a78;
  iVar14 = secp256k1_schnorrsig_sign_internal
                     (psVar27,(uchar *)0x0,local_3d8,0x20,(secp256k1_keypair *)local_168,
                      nonce_function_bip340,(void *)0x0);
  psVar27 = CTX;
  if (iVar14 != 0) goto LAB_00145a55;
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_3ec._4_8_;
  (psVar27->illegal_callback).data = pvStack_3e0;
  if ((uchar  [4])local_3ec._0_4_ != (uchar  [4])0x1) goto LAB_00145a5a;
  local_3ec[0] = '\0';
  local_3ec[1] = '\0';
  local_3ec[2] = '\0';
  local_3ec[3] = '\0';
  local_3ec._4_8_ = (psVar27->illegal_callback).fn;
  pvStack_3e0 = (psVar27->illegal_callback).data;
  if (psVar27 == &secp256k1_context_static_) goto LAB_00145a5f;
  (psVar27->illegal_callback).fn = counting_callback_fn;
  (psVar27->illegal_callback).data = pubkey_00;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x143af4;
  iVar14 = secp256k1_schnorrsig_sign_internal
                     (psVar27,local_398,(uchar *)0x0,0x20,(secp256k1_keypair *)local_168,
                      nonce_function_bip340,(void *)0x0);
  psVar27 = CTX;
  if (iVar14 != 0) goto LAB_00145a64;
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_3ec._4_8_;
  (psVar27->illegal_callback).data = pvStack_3e0;
  if ((uchar  [4])local_3ec._0_4_ != (uchar  [4])0x1) goto LAB_00145a69;
  local_3ec[0] = '\0';
  local_3ec[1] = '\0';
  local_3ec[2] = '\0';
  local_3ec[3] = '\0';
  local_3ec._4_8_ = (psVar27->illegal_callback).fn;
  pvStack_3e0 = (psVar27->illegal_callback).data;
  if (psVar27 == &secp256k1_context_static_) goto LAB_00145a6e;
  (psVar27->illegal_callback).fn = counting_callback_fn;
  (psVar27->illegal_callback).data = pubkey_00;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x143b6e;
  iVar14 = secp256k1_schnorrsig_sign_internal
                     (psVar27,local_398,local_3d8,0x20,(secp256k1_keypair *)0x0,
                      nonce_function_bip340,(void *)0x0);
  psVar27 = CTX;
  if (iVar14 != 0) goto LAB_00145a73;
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_3ec._4_8_;
  (psVar27->illegal_callback).data = pvStack_3e0;
  if ((uchar  [4])local_3ec._0_4_ != (uchar  [4])0x1) goto LAB_00145a78;
  local_3ec[0] = '\0';
  local_3ec[1] = '\0';
  local_3ec[2] = '\0';
  local_3ec[3] = '\0';
  local_3ec._4_8_ = (psVar27->illegal_callback).fn;
  pvStack_3e0 = (psVar27->illegal_callback).data;
  if (psVar27 == &secp256k1_context_static_) goto LAB_00145a7d;
  (psVar27->illegal_callback).fn = counting_callback_fn;
  (psVar27->illegal_callback).data = pubkey_00;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x143bed;
  iVar14 = secp256k1_schnorrsig_sign_internal
                     (psVar27,local_398,local_3d8,0x20,(secp256k1_keypair *)local_358,
                      nonce_function_bip340,(void *)0x0);
  psVar27 = CTX;
  if (iVar14 != 0) goto LAB_00145a82;
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_3ec._4_8_;
  (psVar27->illegal_callback).data = pvStack_3e0;
  psVar27 = STATIC_CTX;
  if ((uchar  [4])local_3ec._0_4_ != (uchar  [4])0x1) goto LAB_00145a87;
  local_3ec[0] = '\0';
  local_3ec[1] = '\0';
  local_3ec[2] = '\0';
  local_3ec[3] = '\0';
  local_3ec._4_8_ = (STATIC_CTX->illegal_callback).fn;
  pvStack_3e0 = (STATIC_CTX->illegal_callback).data;
  if (STATIC_CTX == &secp256k1_context_static_) goto LAB_00145a8c;
  (STATIC_CTX->illegal_callback).fn = counting_callback_fn;
  (psVar27->illegal_callback).data = pubkey_00;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x143c70;
  iVar14 = secp256k1_schnorrsig_sign_internal
                     (psVar27,local_398,local_3d8,0x20,(secp256k1_keypair *)local_168,
                      nonce_function_bip340,(void *)0x0);
  psVar27 = STATIC_CTX;
  if (iVar14 != 0) goto LAB_00145a91;
  (STATIC_CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_3ec._4_8_;
  (psVar27->illegal_callback).data = pvStack_3e0;
  if ((uchar  [4])local_3ec._0_4_ != (uchar  [4])0x1) goto LAB_00145a96;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x143cbe;
  iVar14 = secp256k1_schnorrsig_sign_custom
                     (CTX,local_398,local_3d8,0x20,(secp256k1_keypair *)local_168,&local_3b8);
  psVar27 = CTX;
  if (iVar14 == 0) goto LAB_00145a9b;
  local_3ec[0] = '\0';
  local_3ec[1] = '\0';
  local_3ec[2] = '\0';
  local_3ec[3] = '\0';
  local_3ec._4_8_ = (CTX->illegal_callback).fn;
  pvStack_3e0 = (CTX->illegal_callback).data;
  if (CTX == &secp256k1_context_static_) goto LAB_00145aa0;
  (CTX->illegal_callback).fn = counting_callback_fn;
  (psVar27->illegal_callback).data = pubkey_00;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x143d16;
  iVar14 = secp256k1_schnorrsig_sign_custom
                     (psVar27,(uchar *)0x0,local_3d8,0x20,(secp256k1_keypair *)local_168,&local_3b8)
  ;
  psVar27 = CTX;
  if (iVar14 != 0) goto LAB_00145aa5;
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_3ec._4_8_;
  (psVar27->illegal_callback).data = pvStack_3e0;
  if ((uchar  [4])local_3ec._0_4_ != (uchar  [4])0x1) goto LAB_00145aaa;
  local_3ec[0] = '\0';
  local_3ec[1] = '\0';
  local_3ec[2] = '\0';
  local_3ec[3] = '\0';
  local_3ec._4_8_ = (psVar27->illegal_callback).fn;
  pvStack_3e0 = (psVar27->illegal_callback).data;
  if (psVar27 == &secp256k1_context_static_) goto LAB_00145aaf;
  (psVar27->illegal_callback).fn = counting_callback_fn;
  (psVar27->illegal_callback).data = pubkey_00;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x143d88;
  iVar14 = secp256k1_schnorrsig_sign_custom
                     (psVar27,local_398,(uchar *)0x0,0x20,(secp256k1_keypair *)local_168,&local_3b8)
  ;
  psVar27 = CTX;
  if (iVar14 != 0) goto LAB_00145ab4;
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_3ec._4_8_;
  (psVar27->illegal_callback).data = pvStack_3e0;
  if ((uchar  [4])local_3ec._0_4_ != (uchar  [4])0x1) goto LAB_00145ab9;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x143dc9;
  iVar14 = secp256k1_schnorrsig_sign_custom
                     (psVar27,local_398,(uchar *)0x0,0,(secp256k1_keypair *)local_168,&local_3b8);
  psVar27 = CTX;
  if (iVar14 == 0) goto LAB_00145abe;
  local_3ec[0] = '\0';
  local_3ec[1] = '\0';
  local_3ec[2] = '\0';
  local_3ec[3] = '\0';
  local_3ec._4_8_ = (CTX->illegal_callback).fn;
  pvStack_3e0 = (CTX->illegal_callback).data;
  if (CTX == &secp256k1_context_static_) goto LAB_00145ac3;
  (CTX->illegal_callback).fn = counting_callback_fn;
  (psVar27->illegal_callback).data = pubkey_00;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x143e1f;
  iVar14 = secp256k1_schnorrsig_sign_custom
                     (psVar27,local_398,local_3d8,0x20,(secp256k1_keypair *)0x0,&local_3b8);
  psVar27 = CTX;
  if (iVar14 != 0) goto LAB_00145ac8;
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_3ec._4_8_;
  (psVar27->illegal_callback).data = pvStack_3e0;
  if ((uchar  [4])local_3ec._0_4_ != (uchar  [4])0x1) goto LAB_00145acd;
  local_3ec[0] = '\0';
  local_3ec[1] = '\0';
  local_3ec[2] = '\0';
  local_3ec[3] = '\0';
  local_3ec._4_8_ = (psVar27->illegal_callback).fn;
  pvStack_3e0 = (psVar27->illegal_callback).data;
  if (psVar27 == &secp256k1_context_static_) goto LAB_00145ad2;
  (psVar27->illegal_callback).fn = counting_callback_fn;
  (psVar27->illegal_callback).data = pubkey_00;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x143e94;
  iVar14 = secp256k1_schnorrsig_sign_custom
                     (psVar27,local_398,local_3d8,0x20,(secp256k1_keypair *)local_358,&local_3b8);
  psVar27 = CTX;
  if (iVar14 != 0) goto LAB_00145ad7;
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_3ec._4_8_;
  (psVar27->illegal_callback).data = pvStack_3e0;
  if ((uchar  [4])local_3ec._0_4_ != (uchar  [4])0x1) goto LAB_00145adc;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x143ee1;
  iVar14 = secp256k1_schnorrsig_sign_internal
                     (psVar27,local_398,local_3d8,0x20,(secp256k1_keypair *)local_168,
                      (secp256k1_nonce_function_hardened)0x0,(void *)0x0);
  psVar27 = CTX;
  if (iVar14 == 0) goto LAB_00145ae1;
  local_3ec[0] = '\0';
  local_3ec[1] = '\0';
  local_3ec[2] = '\0';
  local_3ec[3] = '\0';
  local_3ec._4_8_ = (CTX->illegal_callback).fn;
  pvStack_3e0 = (CTX->illegal_callback).data;
  if (CTX == &secp256k1_context_static_) goto LAB_00145ae6;
  (CTX->illegal_callback).fn = counting_callback_fn;
  (psVar27->illegal_callback).data = pubkey_00;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x143f3f;
  iVar14 = secp256k1_schnorrsig_sign_custom
                     (psVar27,local_398,local_3d8,0x20,(secp256k1_keypair *)local_168,&local_48);
  psVar27 = CTX;
  if (iVar14 != 0) goto LAB_00145aeb;
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_3ec._4_8_;
  (psVar27->illegal_callback).data = pvStack_3e0;
  psVar27 = STATIC_CTX;
  if ((uchar  [4])local_3ec._0_4_ != (uchar  [4])0x1) goto LAB_00145af0;
  local_3ec[0] = '\0';
  local_3ec[1] = '\0';
  local_3ec[2] = '\0';
  local_3ec[3] = '\0';
  local_3ec._4_8_ = (STATIC_CTX->illegal_callback).fn;
  pvStack_3e0 = (STATIC_CTX->illegal_callback).data;
  if (STATIC_CTX == &secp256k1_context_static_) goto LAB_00145af5;
  (STATIC_CTX->illegal_callback).fn = counting_callback_fn;
  (psVar27->illegal_callback).data = pubkey_00;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x143fb8;
  iVar14 = secp256k1_schnorrsig_sign_custom
                     (psVar27,local_398,local_3d8,0x20,(secp256k1_keypair *)local_168,&local_3b8);
  psVar27 = STATIC_CTX;
  if (iVar14 != 0) goto LAB_00145afa;
  (STATIC_CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_3ec._4_8_;
  (psVar27->illegal_callback).data = pvStack_3e0;
  if ((uchar  [4])local_3ec._0_4_ != (uchar  [4])0x1) goto LAB_00145aff;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x144010;
  iVar14 = secp256k1_schnorrsig_sign_internal
                     (CTX,local_398,local_3d8,0x20,(secp256k1_keypair *)local_168,
                      nonce_function_bip340,(void *)0x0);
  if (iVar14 == 0) goto LAB_00145b04;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x14403b;
  iVar14 = secp256k1_schnorrsig_verify
                     (CTX,local_398,local_3d8,0x20,(secp256k1_xonly_pubkey *)local_228);
  psVar27 = CTX;
  if (iVar14 == 0) goto LAB_00145b09;
  local_3ec[0] = '\0';
  local_3ec[1] = '\0';
  local_3ec[2] = '\0';
  local_3ec[3] = '\0';
  local_3ec._4_8_ = (CTX->illegal_callback).fn;
  pvStack_3e0 = (CTX->illegal_callback).data;
  if (CTX == &secp256k1_context_static_) goto LAB_00145b0e;
  (CTX->illegal_callback).fn = counting_callback_fn;
  (psVar27->illegal_callback).data = pubkey_00;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x14408e;
  iVar14 = secp256k1_schnorrsig_verify
                     (psVar27,(uchar *)0x0,local_3d8,0x20,(secp256k1_xonly_pubkey *)local_228);
  psVar27 = CTX;
  if (iVar14 != 0) goto LAB_00145b13;
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_3ec._4_8_;
  (psVar27->illegal_callback).data = pvStack_3e0;
  if ((uchar  [4])local_3ec._0_4_ != (uchar  [4])0x1) goto LAB_00145b18;
  local_3ec[0] = '\0';
  local_3ec[1] = '\0';
  local_3ec[2] = '\0';
  local_3ec[3] = '\0';
  local_3ec._4_8_ = (psVar27->illegal_callback).fn;
  pvStack_3e0 = (psVar27->illegal_callback).data;
  if (psVar27 == &secp256k1_context_static_) goto LAB_00145b1d;
  (psVar27->illegal_callback).fn = counting_callback_fn;
  (psVar27->illegal_callback).data = pubkey_00;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1440fb;
  iVar14 = secp256k1_schnorrsig_verify
                     (psVar27,local_398,(uchar *)0x0,0x20,(secp256k1_xonly_pubkey *)local_228);
  psVar27 = CTX;
  if (iVar14 != 0) goto LAB_00145b22;
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_3ec._4_8_;
  (psVar27->illegal_callback).data = pvStack_3e0;
  if ((uchar  [4])local_3ec._0_4_ != (uchar  [4])0x1) goto LAB_00145b27;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x144137;
  iVar14 = secp256k1_schnorrsig_verify
                     (psVar27,local_398,(uchar *)0x0,0,(secp256k1_xonly_pubkey *)local_228);
  psVar27 = CTX;
  if (iVar14 != 0) goto LAB_00145b2c;
  local_3ec[0] = '\0';
  local_3ec[1] = '\0';
  local_3ec[2] = '\0';
  local_3ec[3] = '\0';
  local_3ec._4_8_ = (CTX->illegal_callback).fn;
  pvStack_3e0 = (CTX->illegal_callback).data;
  if (CTX == &secp256k1_context_static_) goto LAB_00145b31;
  (CTX->illegal_callback).fn = counting_callback_fn;
  (psVar27->illegal_callback).data = pubkey_00;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x144188;
  iVar14 = secp256k1_schnorrsig_verify
                     (psVar27,local_398,local_3d8,0x20,(secp256k1_xonly_pubkey *)0x0);
  psVar27 = CTX;
  if (iVar14 != 0) goto LAB_00145b36;
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_3ec._4_8_;
  (psVar27->illegal_callback).data = pvStack_3e0;
  if ((uchar  [4])local_3ec._0_4_ != (uchar  [4])0x1) goto LAB_00145b3b;
  local_3ec[0] = '\0';
  local_3ec[1] = '\0';
  local_3ec[2] = '\0';
  local_3ec[3] = '\0';
  local_3ec._4_8_ = (psVar27->illegal_callback).fn;
  pvStack_3e0 = (psVar27->illegal_callback).data;
  if (psVar27 == &secp256k1_context_static_) goto LAB_00145b40;
  (psVar27->illegal_callback).fn = counting_callback_fn;
  (psVar27->illegal_callback).data = pubkey_00;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1441f8;
  iVar14 = secp256k1_schnorrsig_verify
                     (psVar27,local_398,local_3d8,0x20,(secp256k1_xonly_pubkey *)local_288);
  psVar27 = CTX;
  if (iVar14 != 0) goto LAB_00145b45;
  (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_3ec._4_8_;
  (psVar27->illegal_callback).data = pvStack_3e0;
  if ((uchar  [4])local_3ec._0_4_ != (uchar  [4])0x1) goto LAB_00145b4a;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x14423a;
  secp256k1_sha256_initialize_tagged
            ((secp256k1_sha256 *)local_168,(uchar *)"BIP0340/challenge",0x11);
  local_228._0_8_ = 0x239253819cecba11;
  local_228._8_8_ = (secp256k1_nonce_function_hardened)0xd1627e0f11679112;
  local_228._16_8_ = (void *)0x3cc76597c87550;
  local_228._24_8_ = 0x33e9b66a90f61164;
  local_1e8.data[0x20] = '@';
  local_1e8.data[0x21] = '\0';
  local_1e8.data[0x22] = '\0';
  local_1e8.data[0x23] = '\0';
  local_1e8.data[0x24] = '\0';
  local_1e8.data[0x25] = '\0';
  local_1e8.data[0x26] = '\0';
  local_1e8.data[0x27] = '\0';
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x14426a;
  test_sha256_eq((secp256k1_sha256 *)local_168,(secp256k1_sha256 *)local_228);
  local_228._16_8_ = (void *)0x0;
  local_228._24_8_ = 0x300000000000000;
  local_228._0_8_ = 0;
  local_228._8_8_ = (secp256k1_nonce_function_hardened)0x0;
  local_348 = (secp256k1_nonce_function_hardened *)0xb0996f8345c831b5;
  psStack_340 = (secp256k1_schnorrsig_extraparams *)0xf936e0bc13f10186;
  local_358 = (undefined1  [8])0x10c35892018a30f9;
  psStack_350 = (secp256k1_schnorrsig_extraparams *)0x29529df8854f3449;
  local_278 = ZEXT816(0);
  local_288 = ZEXT816(0);
  local_398._16_8_ = (void *)0x0;
  local_398._24_8_ = 0;
  local_398._0_8_ = 0;
  local_398._8_8_ = (secp256k1_nonce_function_hardened)0x0;
  local_168._48_8_ = 0x472f17b2fde8eeeb;
  local_168._56_8_ = 0xc03605310d90f47d;
  local_168._32_8_ = 0x718bea854a6af625;
  local_168._40_8_ = 0xe52c2d384fa782e4;
  local_168._16_8_ = (_func_void_char_ptr_void_ptr *)0x8b007835f1cdf4b;
  local_168._24_8_ = (void *)0x1582ca2dcef1554c;
  local_168._0_8_ = (_func_void_char_ptr_void_ptr *)0x108d84801f8307e9;
  local_168._8_8_ = (secp256k1_nonce_function_hardened)0x361024401b37a569;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x14431b;
  test_schnorrsig_bip_vectors_check_signing(local_228,local_358,local_288,local_398,0x20,local_168);
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x144334;
  test_schnorrsig_bip_vectors_check_verify(local_358,local_398,0x20,local_168,1);
  local_228._16_8_ = (void *)0x56dab4380f16e762;
  local_228._24_8_ = 0xefcf905104d984a7;
  local_228._0_8_ = 0x6a2aed8a6251e1b7;
  local_228._8_8_ = (secp256k1_nonce_function_hardened)0xc7f3f49c805871bf;
  local_348 = (secp256k1_nonce_function_hardened *)0xd8cedea21daefe58;
  psStack_340 = (secp256k1_schnorrsig_extraparams *)0x59a62b507b0f2443;
  local_358 = (undefined1  [8])0x5f1c672a7fd7f1df;
  psStack_350 = (secp256k1_schnorrsig_extraparams *)0xbe4123db26371836;
  local_278._0_8_ = (void *)0x0;
  local_278._8_8_ = 0x100000000000000;
  local_288 = ZEXT816(0);
  local_398._16_8_ = (void *)0xd0319f29223809a4;
  local_398._24_8_ = 0x896c4eec98fa2e08;
  local_398._0_8_ = 0xd308a385886a3f24;
  local_398._8_8_ = (secp256k1_nonce_function_hardened)0x447370032e8a1913;
  local_168._48_8_ = 0x1c87ea39b6fc7e89;
  local_168._56_8_ = 0xa4b9e33def695fa;
  local_168._32_8_ = 0xccab76c91ad10689;
  local_168._40_8_ = 0xeaf4bf9212090bb2;
  local_168._16_8_ = (_func_void_char_ptr_void_ptr *)0x17f9436d3e41de1b;
  local_168._24_8_ = (void *)0x4133de788ccf8ddc;
  local_168._0_8_ = (_func_void_char_ptr_void_ptr *)0x6d29aeee60bd9668;
  local_168._8_8_ = (secp256k1_nonce_function_hardened)0x7fe1df79f228ab4;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x144401;
  test_schnorrsig_bip_vectors_check_signing(local_228,local_358,local_288,local_398,0x20,local_168);
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x14441a;
  test_schnorrsig_bip_vectors_check_verify(local_358,local_398,0x20,local_168,1);
  local_228._16_8_ = (void *)0x74cc678a084e0229;
  local_228._24_8_ = 0xc9e5143ba6be0b02;
  local_228._0_8_ = 0x34c26821a2da0fc9;
  local_228._8_8_ = (secp256k1_nonce_function_hardened)0xd11cdc808b62c6c4;
  local_348 = (secp256k1_nonce_function_hardened *)0xc986b00953713901;
  psStack_340 = (secp256k1_schnorrsig_extraparams *)0xb84e7769d98fe160;
  local_358 = (undefined1  [8])0x137e77c5fe8a30dd;
  psStack_350 = (secp256k1_schnorrsig_extraparams *)0xccb7c19c2ba71f12;
  local_278._8_8_ = 0x6d9e698d7620b4b;
  local_278._0_8_ = 0x2c69d1c6cd760e08;
  local_288._8_8_ = 0xccbcbbb5a235b02e;
  local_288._0_8_ = 0xaed7b42438a57ac8;
  local_398._16_8_ = (void *)0x33776cb5aa0598da;
  local_398._24_8_ = 0x5cb708a5d0b92430;
  local_398._0_8_ = 0x1adfbcb3d8582d7e;
  local_398._8_8_ = (secp256k1_nonce_function_hardened)0xdf9549082c7deba;
  local_168._48_8_ = 0x1e48f8828da9de7a;
  local_168._56_8_ = 0xb73f6f4a67031e0e;
  local_168._32_8_ = 0x4a95ada5795874ab;
  local_168._40_8_ = 0x3c1da5c3915ac472;
  local_168._16_8_ = (_func_void_char_ptr_void_ptr *)0x8b8d72602acf9bc4;
  local_168._24_8_ = (void *)0x1b3c31dd500f204c;
  local_168._0_8_ = (_func_void_char_ptr_void_ptr *)0xb74bb4d7eeaa3158;
  local_168._8_8_ = (secp256k1_nonce_function_hardened)0x94429dba94ab5e4e;
  psVar41 = (secp256k1_schnorrsig_extraparams *)local_228;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1444e3;
  test_schnorrsig_bip_vectors_check_signing
            ((uchar *)psVar41,local_358,local_288,local_398,0x20,local_168);
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1444fc;
  test_schnorrsig_bip_vectors_check_verify(local_358,local_398,0x20,local_168,1);
  local_228._16_8_ = (void *)0x54a23fcf62307712;
  local_228._24_8_ = 0x101740d28ef5449e;
  local_228._0_8_ = 0x81739377262b430b;
  local_228._8_8_ = (secp256k1_nonce_function_hardened)0xd0ec662ab05bf0ae;
  local_348 = (secp256k1_nonce_function_hardened *)0x8a461df2fb950d3a;
  psStack_340 = (secp256k1_schnorrsig_extraparams *)0x17f5d860c1f8331b;
  local_358 = (undefined1  [8])0x25f50551f9dfd125;
  psStack_350 = (secp256k1_schnorrsig_extraparams *)0xad96a928f622403c;
  local_278._8_4_ = 0xffffffff;
  local_278._0_8_ = 0xffffffffffffffff;
  local_278._12_4_ = 0xffffffff;
  local_288._8_4_ = 0xffffffff;
  local_288._0_8_ = 0xffffffffffffffff;
  local_288._12_4_ = 0xffffffff;
  local_398._16_8_ = (void *)0xffffffffffffffff;
  local_398._24_8_ = 0xffffffffffffffff;
  local_398._0_8_ = 0xffffffffffffffff;
  local_398._8_8_ = (secp256k1_nonce_function_hardened)0xffffffffffffffff;
  local_168._48_8_ = 0x27b3eb8188d75ff2;
  local_168._56_8_ = 0xa36ec6ef2259fc71;
  local_168._32_8_ = 0x93b33db19c2b5897;
  local_168._40_8_ = 0x5aaf82a92bb30537;
  local_168._16_8_ = (_func_void_char_ptr_void_ptr *)0xb651dd87a1c1ec65;
  local_168._24_8_ = (void *)0xecd53796dc1eda4f;
  local_168._0_8_ = (_func_void_char_ptr_void_ptr *)0xf146e2579750b07e;
  local_168._8_8_ = (secp256k1_nonce_function_hardened)0xb91c615156884994;
  pubkey_00 = (secp256k1_schnorrsig_extraparams *)local_228;
  keypair_00 = (code *)local_358;
  pubkey = (secp256k1_schnorrsig_extraparams *)local_398;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1445b0;
  test_schnorrsig_bip_vectors_check_signing
            ((uchar *)pubkey_00,(uchar *)keypair_00,local_288,(uchar *)pubkey,0x20,local_168);
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1445c9;
  test_schnorrsig_bip_vectors_check_verify((uchar *)keypair_00,(uchar *)pubkey,0x20,local_168,1);
  local_228._16_8_ = (void *)0xaae28b6d7430fa7d;
  local_228._24_8_ = 0xb9c72dd2295f9765;
  local_228._0_8_ = 0x12e499bb09359cd6;
  local_228._8_8_ = (secp256k1_nonce_function_hardened)0x83724e54e80f8be6;
  local_348 = (secp256k1_nonce_function_hardened *)0x9b591ac87578f199;
  psStack_340 = (secp256k1_schnorrsig_extraparams *)0x36769b989986c56;
  local_358 = (undefined1  [8])0xb283cc8ff6c3f34d;
  psStack_350 = (secp256k1_schnorrsig_extraparams *)0x24a73104c9429d7e;
  local_168._48_8_ = 0x93f5804ec071cb60;
  local_168._56_8_ = 0xf4d70883d2070b06;
  local_168._32_8_ = 0xb303f68a54b1af76;
  local_168._40_8_ = 0x10ee7d20f8c945eb;
  local_168._16_8_ = (_func_void_char_ptr_void_ptr *)0x28aaf51494eda089;
  local_168._24_8_ = (void *)0x639c5f79d6960dad;
  local_168._0_8_ = (_func_void_char_ptr_void_ptr *)0x0;
  local_168._8_8_ = (secp256k1_nonce_function_hardened)0x3f56ce783b000000;
  extraparams = (secp256k1_context *)local_228;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x14464d;
  test_schnorrsig_bip_vectors_check_verify((uchar *)extraparams,local_358,0x20,local_168,1);
  local_228._16_8_ = (void *)0x8776b979ae9898eb;
  local_228._24_8_ = 0x344a2d4aa0fae466;
  local_228._0_8_ = 0x507767db4ceafdee;
  local_228._8_8_ = (secp256k1_nonce_function_hardened)0x21cfea07e8fe20a4;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x14467e;
  iVar14 = secp256k1_xonly_pubkey_parse(CTX,(secp256k1_xonly_pubkey *)local_168,local_228);
  if (iVar14 != 0) goto LAB_00145b4f;
  local_228._16_8_ = (void *)0xd8cedea21daefe58;
  local_228._24_8_ = 0x59a62b507b0f2443;
  local_228._0_8_ = 0x5f1c672a7fd7f1df;
  local_228._8_8_ = (secp256k1_nonce_function_hardened)0xbe4123db26371836;
  local_348 = (secp256k1_nonce_function_hardened *)0xd0319f29223809a4;
  psStack_340 = (secp256k1_schnorrsig_extraparams *)0x896c4eec98fa2e08;
  local_358 = (undefined1  [8])0xd308a385886a3f24;
  psStack_350 = (secp256k1_schnorrsig_extraparams *)0x447370032e8a1913;
  local_168._48_8_ = 0x5ebe66e143c6737a;
  local_168._56_8_ = 0xe253c51a4ba3afbe;
  local_168._32_8_ = 0x7c60a644479c23c;
  local_168._40_8_ = 0xefd92309e17a10cd;
  local_168._16_8_ = (_func_void_char_ptr_void_ptr *)0x8ba168852f47f682;
  local_168._24_8_ = (void *)0x56752960147a052f;
  local_168._0_8_ = (_func_void_char_ptr_void_ptr *)0xa4ee5e75d57bf9ff;
  local_168._8_8_ = (secp256k1_nonce_function_hardened)0xd3355235143a4520;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x14470d;
  test_schnorrsig_bip_vectors_check_verify(local_228,local_358,0x20,local_168,0);
  local_228._16_8_ = (void *)0xd8cedea21daefe58;
  local_228._24_8_ = 0x59a62b507b0f2443;
  local_228._0_8_ = 0x5f1c672a7fd7f1df;
  local_228._8_8_ = (secp256k1_nonce_function_hardened)0xbe4123db26371836;
  local_348 = (secp256k1_nonce_function_hardened *)0xd0319f29223809a4;
  psStack_340 = (secp256k1_schnorrsig_extraparams *)0x896c4eec98fa2e08;
  local_358 = (undefined1  [8])0xd308a385886a3f24;
  psStack_350 = (secp256k1_schnorrsig_extraparams *)0x447370032e8a1913;
  local_168._48_8_ = 0x355754fe4c952a62;
  local_168._56_8_ = 0xbdb2cdfc3451eaaa;
  local_168._32_8_ = 0x89716edb3e0b8928;
  local_168._40_8_ = 0xf8e45c518b4430b6;
  local_168._16_8_ = (_func_void_char_ptr_void_ptr *)0xf46f3fdf13b032b4;
  local_168._24_8_ = (void *)0x5f51e1e033cb9ff9;
  local_168._0_8_ = (_func_void_char_ptr_void_ptr *)0x1cc2db1e332ea61f;
  local_168._8_8_ = (secp256k1_nonce_function_hardened)0xa70011abd2924739;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x144794;
  test_schnorrsig_bip_vectors_check_verify(local_228,local_358,0x20,local_168,0);
  local_228._16_8_ = (void *)0xd8cedea21daefe58;
  local_228._24_8_ = 0x59a62b507b0f2443;
  local_228._0_8_ = 0x5f1c672a7fd7f1df;
  local_228._8_8_ = (secp256k1_nonce_function_hardened)0xbe4123db26371836;
  local_348 = (secp256k1_nonce_function_hardened *)0xd0319f29223809a4;
  psStack_340 = (secp256k1_schnorrsig_extraparams *)0x896c4eec98fa2e08;
  local_358 = (undefined1  [8])0xd308a385886a3f24;
  psStack_350 = (secp256k1_schnorrsig_extraparams *)0x447370032e8a1913;
  local_168._48_8_ = 0xcedc5003ec9d7e8;
  local_168._56_8_ = 0xa66d2e0c0dff3418;
  local_168._32_8_ = 0xfc2f9baab3641796;
  local_168._40_8_ = 0x26a287687b94efb6;
  local_168._16_8_ = (_func_void_char_ptr_void_ptr *)0x96d9b2896097c174;
  local_168._24_8_ = (void *)0x6977173e54e5a23d;
  local_168._0_8_ = (_func_void_char_ptr_void_ptr *)0xea696ca83b5cff6c;
  local_168._8_8_ = (secp256k1_nonce_function_hardened)0x4fcb9b1af376734b;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x14481d;
  test_schnorrsig_bip_vectors_check_verify(local_228,local_358,0x20,local_168,0);
  local_228._16_8_ = (void *)0xd8cedea21daefe58;
  local_228._24_8_ = 0x59a62b507b0f2443;
  local_228._0_8_ = 0x5f1c672a7fd7f1df;
  local_228._8_8_ = (secp256k1_nonce_function_hardened)0xbe4123db26371836;
  local_348 = (secp256k1_nonce_function_hardened *)0xd0319f29223809a4;
  psStack_340 = (secp256k1_schnorrsig_extraparams *)0x896c4eec98fa2e08;
  local_358 = (undefined1  [8])0xd308a385886a3f24;
  psStack_350 = (secp256k1_schnorrsig_extraparams *)0x447370032e8a1913;
  local_168._48_8_ = 0xdc94d5f07634b74f;
  local_168._56_8_ = 0x516018bd25645cb6;
  local_168._32_8_ = 0x239caf2883da3d12;
  local_168._40_8_ = 0xba23d1cfee1f4ca9;
  local_168._16_8_ = (_func_void_char_ptr_void_ptr *)0x0;
  local_168._24_8_ = (void *)0x0;
  local_168._0_8_ = (_func_void_char_ptr_void_ptr *)0x0;
  local_168._8_8_ = (secp256k1_nonce_function_hardened)0x0;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1448a6;
  test_schnorrsig_bip_vectors_check_verify(local_228,local_358,0x20,local_168,0);
  local_228._16_8_ = (void *)0xd8cedea21daefe58;
  local_228._24_8_ = 0x59a62b507b0f2443;
  local_228._0_8_ = 0x5f1c672a7fd7f1df;
  local_228._8_8_ = (secp256k1_nonce_function_hardened)0xbe4123db26371836;
  local_348 = (secp256k1_nonce_function_hardened *)0xd0319f29223809a4;
  psStack_340 = (secp256k1_schnorrsig_extraparams *)0x896c4eec98fa2e08;
  local_358 = (undefined1  [8])0xd308a385886a3f24;
  psStack_350 = (secp256k1_schnorrsig_extraparams *)0x447370032e8a1913;
  local_168._48_8_ = 0xf95467ac117fa8db;
  local_168._56_8_ = 0x97f17c83a1d58037;
  local_168._32_8_ = 0x6488e25aaffb1576;
  local_168._40_8_ = 0xb4adde4297093c01;
  local_168._16_8_ = (_func_void_char_ptr_void_ptr *)0x0;
  local_168._24_8_ = (void *)0x100000000000000;
  local_168._0_8_ = (_func_void_char_ptr_void_ptr *)0x0;
  local_168._8_8_ = (secp256k1_nonce_function_hardened)0x0;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x14492f;
  test_schnorrsig_bip_vectors_check_verify(local_228,local_358,0x20,local_168,0);
  local_228._16_8_ = (void *)0xd8cedea21daefe58;
  local_228._24_8_ = 0x59a62b507b0f2443;
  local_228._0_8_ = 0x5f1c672a7fd7f1df;
  local_228._8_8_ = (secp256k1_nonce_function_hardened)0xbe4123db26371836;
  local_348 = (secp256k1_nonce_function_hardened *)0xd0319f29223809a4;
  psStack_340 = (secp256k1_schnorrsig_extraparams *)0x896c4eec98fa2e08;
  local_358 = (undefined1  [8])0xd308a385886a3f24;
  psStack_350 = (secp256k1_schnorrsig_extraparams *)0x447370032e8a1913;
  local_168._48_8_ = 0x2fb382aea813d7d1;
  local_168._56_8_ = 0x9bd307c47f5f9da7;
  local_168._32_8_ = 0x3d064554c9be869;
  local_168._40_8_ = 0xd75d7897846b1049;
  local_168._16_8_ = (_func_void_char_ptr_void_ptr *)0xc79b260f2ba84d56;
  local_168._24_8_ = (void *)0x1dba290422f8740a;
  local_168._0_8_ = (_func_void_char_ptr_void_ptr *)0x5a3957aeac8d294a;
  local_168._8_8_ = (secp256k1_nonce_function_hardened)0xcb1dfddb5d79d015;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1449b8;
  test_schnorrsig_bip_vectors_check_verify(local_228,local_358,0x20,local_168,0);
  local_228._16_8_ = (void *)0xd8cedea21daefe58;
  local_228._24_8_ = 0x59a62b507b0f2443;
  local_228._0_8_ = 0x5f1c672a7fd7f1df;
  local_228._8_8_ = (secp256k1_nonce_function_hardened)0xbe4123db26371836;
  local_348 = (secp256k1_nonce_function_hardened *)0xd0319f29223809a4;
  psStack_340 = (secp256k1_schnorrsig_extraparams *)0x896c4eec98fa2e08;
  local_358 = (undefined1  [8])0xd308a385886a3f24;
  psStack_350 = (secp256k1_schnorrsig_extraparams *)0x447370032e8a1913;
  local_168._48_8_ = 0x2fb382aea813d7d1;
  local_168._56_8_ = 0x9bd307c47f5f9da7;
  local_168._32_8_ = 0x3d064554c9be869;
  local_168._40_8_ = 0xd75d7897846b1049;
  local_168._16_8_ = (_func_void_char_ptr_void_ptr *)0xffffffffffffffff;
  local_168._24_8_ = (void *)0x2ffcfffffeffffff;
  local_168._0_8_ = (_func_void_char_ptr_void_ptr *)0xffffffffffffffff;
  local_168._8_8_ = (secp256k1_nonce_function_hardened)0xffffffffffffffff;
  keypair_00 = (code *)local_358;
  pubkey_00 = (secp256k1_schnorrsig_extraparams *)local_168;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x144a41;
  test_schnorrsig_bip_vectors_check_verify(local_228,(uchar *)keypair_00,0x20,(uchar *)pubkey_00,0);
  local_228._16_8_ = (void *)0xd8cedea21daefe58;
  local_228._24_8_ = 0x59a62b507b0f2443;
  local_228._0_8_ = 0x5f1c672a7fd7f1df;
  local_228._8_8_ = (secp256k1_nonce_function_hardened)0xbe4123db26371836;
  local_348 = (secp256k1_nonce_function_hardened *)0xd0319f29223809a4;
  psStack_340 = (secp256k1_schnorrsig_extraparams *)0x896c4eec98fa2e08;
  local_358 = (undefined1  [8])0xd308a385886a3f24;
  psStack_350 = (secp256k1_schnorrsig_extraparams *)0x447370032e8a1913;
  local_168._48_8_ = 0x3ba048afe6dcaeba;
  local_168._56_8_ = 0x414136d08c5ed2bf;
  local_168._32_8_ = 0xffffffffffffffff;
  local_168._40_8_ = 0xfeffffffffffffff;
  local_168._16_8_ = (_func_void_char_ptr_void_ptr *)0x96d9b2896097c174;
  local_168._24_8_ = (void *)0x6977173e54e5a23d;
  local_168._0_8_ = (_func_void_char_ptr_void_ptr *)0xea696ca83b5cff6c;
  local_168._8_8_ = (secp256k1_nonce_function_hardened)0x4fcb9b1af376734b;
  extraparams = (secp256k1_context *)local_228;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x144ac4;
  test_schnorrsig_bip_vectors_check_verify((uchar *)extraparams,local_358,0x20,local_168,0);
  local_228._16_8_ = (void *)0xffffffffffffffff;
  local_228._24_8_ = 0x30fcfffffeffffff;
  local_228._0_8_ = 0xffffffffffffffff;
  local_228._8_8_ = (secp256k1_nonce_function_hardened)0xffffffffffffffff;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x144af5;
  iVar14 = secp256k1_xonly_pubkey_parse(CTX,(secp256k1_xonly_pubkey *)local_168,local_228);
  if (iVar14 != 0) goto LAB_00145b54;
  local_228._16_8_ = (void *)0x4003400340034003;
  local_228._24_8_ = 0x4003400340034003;
  local_228._0_8_ = 0x4003400340034003;
  local_228._8_8_ = (secp256k1_nonce_function_hardened)0x4003400340034003;
  local_348 = (secp256k1_nonce_function_hardened *)0x238be6f6b6faf94b;
  psStack_340 = (secp256k1_schnorrsig_extraparams *)0x17d16f4d32976408;
  local_358 = (undefined1  [8])0xc43a39b453aa8c77;
  psStack_350 = (secp256k1_schnorrsig_extraparams *)0x22877a49094d7767;
  local_278 = ZEXT816(0);
  local_288 = ZEXT816(0);
  local_168._48_8_ = 0x272865ac0f562d9f;
  local_168._56_8_ = 0x63ab27e47405afd1;
  local_168._32_8_ = 0x624603bf26ce6960;
  local_168._40_8_ = 0x648adb623a9af128;
  local_168._16_8_ = (_func_void_char_ptr_void_ptr *)0xccfc326743adb66b;
  local_168._24_8_ = (void *)0xcf645489551a2925;
  local_168._0_8_ = (_func_void_char_ptr_void_ptr *)0xfbd9ec65b15d5371;
  local_168._8_8_ = (secp256k1_nonce_function_hardened)0x1861eafa5f6e04bc;
  local_2b8._40_8_ = 0;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x144ba8;
  test_schnorrsig_bip_vectors_check_signing(local_228,local_358,local_288,(uchar *)0x0,0,local_168);
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x144bbd;
  test_schnorrsig_bip_vectors_check_verify(local_358,(uchar *)0x0,0,local_168,1);
  local_228._16_8_ = (void *)0x4003400340034003;
  local_228._24_8_ = 0x4003400340034003;
  local_228._0_8_ = 0x4003400340034003;
  local_228._8_8_ = (secp256k1_nonce_function_hardened)0x4003400340034003;
  local_348 = (secp256k1_nonce_function_hardened *)0x238be6f6b6faf94b;
  psStack_340 = (secp256k1_schnorrsig_extraparams *)0x17d16f4d32976408;
  local_358 = (undefined1  [8])0xc43a39b453aa8c77;
  psStack_350 = (secp256k1_schnorrsig_extraparams *)0x22877a49094d7767;
  local_278 = ZEXT816(0);
  local_288 = ZEXT816(0);
  unaff_RBP = (code *)CONCAT71((int7)((ulong)unaff_RBP >> 8),0x11);
  local_398[0] = 0x11;
  local_168._48_8_ = 0x337d575afcac7cfe;
  local_168._56_8_ = 0xbfac2bec4c5614ec;
  local_168._32_8_ = 0xbd8366eabf7331ea;
  local_168._40_8_ = 0x9619bc5daaa51f10;
  local_168._16_8_ = (_func_void_char_ptr_void_ptr *)0x354c3be64a93b9b1;
  local_168._24_8_ = (void *)0x3a3c63411aef311;
  local_168._0_8_ = (_func_void_char_ptr_void_ptr *)0x2441f6fe0a0aa208;
  local_168._8_8_ = (secp256k1_nonce_function_hardened)0x3a583c69e0329264;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x144c6b;
  test_schnorrsig_bip_vectors_check_signing(local_228,local_358,local_288,local_398,1,local_168);
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x144c84;
  test_schnorrsig_bip_vectors_check_verify(local_358,local_398,1,local_168,1);
  local_228._16_8_ = (void *)0x4003400340034003;
  local_228._24_8_ = 0x4003400340034003;
  local_228._0_8_ = 0x4003400340034003;
  local_228._8_8_ = (secp256k1_nonce_function_hardened)0x4003400340034003;
  local_348 = (secp256k1_nonce_function_hardened *)0x238be6f6b6faf94b;
  psStack_340 = (secp256k1_schnorrsig_extraparams *)0x17d16f4d32976408;
  local_358 = (undefined1  [8])0xc43a39b453aa8c77;
  psStack_350 = (secp256k1_schnorrsig_extraparams *)0x22877a49094d7767;
  local_278 = ZEXT816(0);
  local_288 = ZEXT816(0);
  local_398[0x10] = 0x11;
  local_398._0_8_ = 0x807060504030201;
  local_398._8_8_ = (secp256k1_nonce_function_hardened)0x100f0e0d0c0b0a09;
  local_168._48_8_ = 0x515a0ed87fa3e5e1;
  local_168._56_8_ = 0xa5a57ea966557c89;
  local_168._32_8_ = 0xf860f97bb782a4c4;
  local_168._40_8_ = 0xec71675be2401568;
  local_168._16_8_ = (_func_void_char_ptr_void_ptr *)0x523c1ea7d199865d;
  local_168._24_8_ = (void *)0x70c30ab5b6fd9ada;
  local_168._0_8_ = (_func_void_char_ptr_void_ptr *)0x3bb459409af33051;
  local_168._8_8_ = (secp256k1_nonce_function_hardened)0x2be5ec199ac0cac7;
  keypair_00 = (code *)local_228;
  pubkey_00 = (secp256k1_schnorrsig_extraparams *)local_358;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x144d3d;
  test_schnorrsig_bip_vectors_check_signing
            ((uchar *)keypair_00,(uchar *)pubkey_00,local_288,local_398,0x11,local_168);
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x144d56;
  test_schnorrsig_bip_vectors_check_verify((uchar *)pubkey_00,local_398,0x11,local_168,1);
  local_348 = (secp256k1_nonce_function_hardened *)0x4003400340034003;
  psStack_340 = (secp256k1_schnorrsig_extraparams *)0x4003400340034003;
  local_358 = (undefined1  [8])0x4003400340034003;
  psStack_350 = (secp256k1_schnorrsig_extraparams *)0x4003400340034003;
  local_278._8_8_ = 0x17d16f4d32976408;
  local_278._0_8_ = 0x238be6f6b6faf94b;
  local_288._8_8_ = 0x22877a49094d7767;
  local_288._0_8_ = 0xc43a39b453aa8c77;
  local_398._16_8_ = (void *)0x0;
  local_398._24_8_ = 0;
  local_398._0_8_ = 0;
  local_398._8_8_ = (secp256k1_nonce_function_hardened)0x0;
  local_1f8 = (_func_void_char_ptr_void_ptr *)0xa0b4d0e9a0cb7f89;
  pvStack_1f0 = (void *)0x6723f249d2cf9468;
  local_228._32_8_ = 0xe7070817e3d35e58;
  uStack_200 = 0x237b4cc50f723bc0;
  local_228._16_8_ = (void *)0x6fbea8bf5d1e3203;
  local_228._24_8_ = 0xa879ca3e16351609;
  local_228._0_8_ = 0x345a55d8b0123b40;
  local_228._8_8_ = (secp256k1_nonce_function_hardened)0x635646c77eea7541;
  local_168._80_4_ = -0x66666667;
  local_168._84_4_ = -0x66666667;
  local_168._88_8_ = 0x9999999999999999;
  local_168._64_8_ = 0x9999999999999999;
  local_168._72_8_ = 0x9999999999999999;
  local_168._48_8_ = 0x9999999999999999;
  local_168._56_8_ = 0x9999999999999999;
  local_168._32_8_ = 0x9999999999999999;
  local_168._40_8_ = 0x9999999999999999;
  local_168._16_8_ = (_func_void_char_ptr_void_ptr *)0x9999999999999999;
  local_168._24_8_ = (void *)0x9999999999999999;
  local_168._0_8_ = (_func_void_char_ptr_void_ptr *)0x9999999999999999;
  local_168._8_8_ = (secp256k1_nonce_function_hardened)0x9999999999999999;
  local_168._96_4_ = 0x99999999;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x144e27;
  test_schnorrsig_bip_vectors_check_signing(local_358,local_288,local_398,local_168,100,local_228);
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x144e40;
  test_schnorrsig_bip_vectors_check_verify(local_288,local_168,100,local_228,1);
  if (0 < COUNT) {
    keypair_00 = (code *)local_288;
    do {
      psVar41 = (secp256k1_schnorrsig_extraparams *)local_168;
      pubkey = (secp256k1_schnorrsig_extraparams *)local_228;
      extraparams = (secp256k1_context *)local_2b8;
      unaff_RBP = nonce_function_bip340;
      local_2f8.ndata = (void *)0x6e68637320612072;
      uStack_2e0._0_4_ = 0x7372726f;
      uStack_2e0._4_4_ = 0x2e2e6769;
      builtin_memcpy(local_2f8.magic,"this",4);
      local_2f8._4_4_ = 0x20736920;
      local_2f8.noncefp = (secp256k1_nonce_function_hardened)0x6f662067736d2061;
      local_398._48_8_ = 0;
      local_398._56_8_ = 0;
      local_398._32_8_ = 0;
      local_398._40_8_ = 0;
      local_398._16_8_ = (void *)0x0;
      local_398._24_8_ = 0;
      local_398._0_8_ = 0;
      local_398._8_8_ = (secp256k1_nonce_function_hardened)0x0;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = local_3c8._8_8_;
      local_3c8 = auVar9 << 0x40;
      local_3d8 = ZEXT816(0x8cb36fda);
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x144ec4;
      testrand256((uchar *)extraparams);
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x144ed1;
      testrand256((uchar *)&(&local_2f8)[1].noncefp);
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x144ee3;
      iVar14 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)psVar41,(uchar *)extraparams);
      if (iVar14 == 0) goto LAB_00145979;
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x144eff;
      iVar14 = secp256k1_keypair_xonly_pub
                         (CTX,(secp256k1_xonly_pubkey *)pubkey,(int *)0x0,
                          (secp256k1_keypair *)psVar41);
      msg_00 = (code *)psVar41;
      if (iVar14 == 0) goto LAB_0014597e;
      pubkey_00 = (secp256k1_schnorrsig_extraparams *)local_358;
      msg_00 = (code *)&local_2f8;
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x144f3c;
      iVar14 = secp256k1_schnorrsig_sign_internal
                         (CTX,(uchar *)pubkey_00,(uchar *)msg_00,0x20,(secp256k1_keypair *)psVar41,
                          nonce_function_bip340,(void *)0x0);
      if (iVar14 == 0) goto LAB_00145983;
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x144f5e;
      iVar14 = secp256k1_schnorrsig_verify
                         (CTX,(uchar *)pubkey_00,(uchar *)msg_00,0x20,
                          (secp256k1_xonly_pubkey *)pubkey);
      if (iVar14 == 0) goto LAB_00145988;
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x144f90;
      iVar14 = secp256k1_schnorrsig_sign_internal
                         (CTX,(uchar *)keypair_00,(uchar *)msg_00,0x20,
                          (secp256k1_keypair *)local_168,nonce_function_bip340,(void *)0x0);
      if (iVar14 == 0) goto LAB_0014598d;
      lVar20 = 0;
      extraparams = (secp256k1_context *)local_3d8;
      do {
        psVar41 = (secp256k1_schnorrsig_extraparams *)msg_00;
        if (local_358[lVar20] != local_288[lVar20]) goto LAB_00145b95;
        lVar20 = lVar20 + 1;
      } while (lVar20 != 0x40);
      pubkey_00 = (secp256k1_schnorrsig_extraparams *)local_358;
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x144fe6;
      iVar14 = secp256k1_schnorrsig_sign_custom
                         (CTX,(uchar *)pubkey_00,(uchar *)msg_00,0x20,(secp256k1_keypair *)local_168
                          ,(secp256k1_schnorrsig_extraparams *)extraparams);
      if (iVar14 == 0) goto LAB_00145992;
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145008;
      iVar14 = secp256k1_schnorrsig_verify
                         (CTX,(uchar *)pubkey_00,(uchar *)msg_00,0x20,
                          (secp256k1_xonly_pubkey *)pubkey);
      if (iVar14 == 0) goto LAB_00145997;
      local_328._8_8_ = 0x101010101010101;
      local_328._0_8_ = 0x101010101010101;
      local_338 = (secp256k1_context *)0x101010101010101;
      uStack_330 = 0x101010101010101;
      local_348 = (secp256k1_nonce_function_hardened *)0x101010101010101;
      psStack_340 = (secp256k1_schnorrsig_extraparams *)0x101010101010101;
      local_358 = (undefined1  [8])0x101010101010101;
      psStack_350 = (secp256k1_schnorrsig_extraparams *)0x101010101010101;
      local_3d8._8_8_ = nonce_function_failing;
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x14506a;
      iVar14 = secp256k1_schnorrsig_sign_custom
                         (CTX,(uchar *)pubkey_00,(uchar *)msg_00,0x20,(secp256k1_keypair *)local_168
                          ,(secp256k1_schnorrsig_extraparams *)extraparams);
      if (iVar14 != 0) goto LAB_0014599c;
      lVar20 = 0;
      psVar41 = (secp256k1_schnorrsig_extraparams *)local_168;
      do {
        if (local_358[lVar20] != local_398[lVar20]) goto LAB_00145b9a;
        lVar20 = lVar20 + 1;
      } while (lVar20 != 0x40);
      local_328._8_8_ = 0x101010101010101;
      local_328._0_8_ = 0x101010101010101;
      local_338 = (secp256k1_context *)0x101010101010101;
      uStack_330 = 0x101010101010101;
      local_348 = (secp256k1_nonce_function_hardened *)0x101010101010101;
      psStack_340 = (secp256k1_schnorrsig_extraparams *)0x101010101010101;
      local_358 = (undefined1  [8])0x101010101010101;
      psStack_350 = (secp256k1_schnorrsig_extraparams *)0x101010101010101;
      local_3d8._8_8_ = nonce_function_0;
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1450f3;
      iVar14 = secp256k1_schnorrsig_sign_custom
                         (CTX,local_358,(uchar *)msg_00,0x20,(secp256k1_keypair *)psVar41,
                          (secp256k1_schnorrsig_extraparams *)extraparams);
      pubkey_00 = (secp256k1_schnorrsig_extraparams *)msg_00;
      if (iVar14 != 0) goto LAB_001459a1;
      lVar20 = 0;
      do {
        psVar27 = extraparams;
        if (local_358[lVar20] != local_398[lVar20]) goto LAB_00145b9f;
        lVar20 = lVar20 + 1;
      } while (lVar20 != 0x40);
      local_328._8_8_ = 0x101010101010101;
      local_328._0_8_ = 0x101010101010101;
      local_338 = (secp256k1_context *)0x101010101010101;
      uStack_330 = 0x101010101010101;
      local_348 = (secp256k1_nonce_function_hardened *)0x101010101010101;
      psStack_340 = (secp256k1_schnorrsig_extraparams *)0x101010101010101;
      local_358 = (undefined1  [8])0x101010101010101;
      psStack_350 = (secp256k1_schnorrsig_extraparams *)0x101010101010101;
      local_3d8._8_8_ = nonce_function_overflowing;
      pubkey_00 = (secp256k1_schnorrsig_extraparams *)local_358;
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145177;
      iVar14 = secp256k1_schnorrsig_sign_custom
                         (CTX,(uchar *)pubkey_00,(uchar *)msg_00,0x20,(secp256k1_keypair *)psVar41,
                          (secp256k1_schnorrsig_extraparams *)extraparams);
      if (iVar14 == 0) goto LAB_001459a6;
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145199;
      iVar14 = secp256k1_schnorrsig_verify
                         (CTX,(uchar *)pubkey_00,(uchar *)msg_00,0x20,
                          (secp256k1_xonly_pubkey *)pubkey);
      if (iVar14 == 0) goto LAB_001459ab;
      local_3d8._8_8_ = 0;
      local_3c8._0_8_ = &(&local_2f8)[1].noncefp;
      psVar27 = (secp256k1_context *)local_168;
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1451dc;
      iVar14 = secp256k1_schnorrsig_sign_custom
                         (CTX,(uchar *)pubkey_00,(uchar *)msg_00,0x20,(secp256k1_keypair *)psVar27,
                          (secp256k1_schnorrsig_extraparams *)extraparams);
      if (iVar14 == 0) goto LAB_001459b0;
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x14520d;
      iVar14 = secp256k1_schnorrsig_sign_internal
                         (CTX,(uchar *)keypair_00,(uchar *)msg_00,0x20,(secp256k1_keypair *)psVar27,
                          nonce_function_bip340,(void *)local_3c8._0_8_);
      pubkey_00 = (secp256k1_schnorrsig_extraparams *)keypair_00;
      if (iVar14 == 0) goto LAB_001459b5;
      lVar20 = 0;
      psVar27 = (secp256k1_context *)local_398;
      do {
        if (local_358[lVar20] != local_288[lVar20]) goto LAB_00145ba4;
        lVar20 = lVar20 + 1;
      } while (lVar20 != 0x40);
      msg_00 = (code *)local_2b8;
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145249;
      testrand256((uchar *)msg_00);
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x14525b;
      iVar14 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)keypair_00,(uchar *)msg_00);
      if (iVar14 == 0) goto LAB_001459ba;
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145277;
      iVar14 = secp256k1_keypair_xonly_pub
                         (CTX,(secp256k1_xonly_pubkey *)psVar27,(int *)0x0,
                          (secp256k1_keypair *)keypair_00);
      if (iVar14 == 0) goto LAB_001459bf;
      psVar41 = (secp256k1_schnorrsig_extraparams *)0x0;
      pubkey_00 = pubkey;
      do {
        pubkey = (secp256k1_schnorrsig_extraparams *)(local_358 + (long)psVar41);
        psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145298;
        testrand256((uchar *)pubkey);
        psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1452bd;
        iVar14 = secp256k1_schnorrsig_sign_internal
                           (CTX,pubkey_00->magic,(uchar *)pubkey,0x20,
                            (secp256k1_keypair *)keypair_00,nonce_function_bip340,(void *)0x0);
        if (iVar14 == 0) {
          psStack_410 = (secp256k1_schnorrsig_extraparams *)0x14596a;
          run_schnorrsig_tests_cold_69();
LAB_0014596a:
          psStack_410 = (secp256k1_schnorrsig_extraparams *)0x14596f;
          run_schnorrsig_tests_cold_68();
          goto LAB_0014596f;
        }
        psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1452df;
        iVar14 = secp256k1_schnorrsig_verify
                           (CTX,pubkey_00->magic,(uchar *)pubkey,0x20,
                            (secp256k1_xonly_pubkey *)psVar27);
        if (iVar14 == 0) goto LAB_0014596a;
        psVar41 = (secp256k1_schnorrsig_extraparams *)&psVar41[1].noncefp;
        pubkey_00 = (secp256k1_schnorrsig_extraparams *)&pubkey_00[2].ndata;
      } while (psVar41 != (secp256k1_schnorrsig_extraparams *)0x60);
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1452ff;
      uVar15 = testrand_int(3);
      uVar36 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
               secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) + secp256k1_test_state[0];
      uVar22 = secp256k1_test_state[1] << 0x11;
      uVar25 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
      uVar48 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
      secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar25;
      secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar48;
      secp256k1_test_state[2] = uVar25 ^ uVar22;
      secp256k1_test_state[3] = uVar48 << 0x2d | uVar48 >> 0x13;
      msg_00 = (code *)(uVar36 >> 0x3b);
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x14536c;
      uVar16 = testrand_int(0xfe);
      pubkey = (secp256k1_schnorrsig_extraparams *)(local_228 + (ulong)uVar15 * 0x40);
      bVar47 = (char)uVar16 + 1;
      pubkey_00 = (secp256k1_schnorrsig_extraparams *)(ulong)CONCAT31((int3)(uVar16 >> 8),bVar47);
      pubkey->magic[(long)((secp256k1_schnorrsig_extraparams *)msg_00)->magic] =
           pubkey->magic[(long)((secp256k1_schnorrsig_extraparams *)msg_00)->magic] ^ bVar47;
      unaff_RBP = (code *)(local_358 + (ulong)uVar15 * 0x20);
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1453b1;
      iVar14 = secp256k1_schnorrsig_verify
                         (CTX,(uchar *)pubkey,(uchar *)unaff_RBP,0x20,
                          (secp256k1_xonly_pubkey *)psVar27);
      if (iVar14 != 0) goto LAB_001459c4;
      pubkey->magic[(long)((secp256k1_schnorrsig_extraparams *)msg_00)->magic] =
           pubkey->magic[(long)((secp256k1_schnorrsig_extraparams *)msg_00)->magic] ^ bVar47;
      uVar36 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
               secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) + secp256k1_test_state[0];
      uVar22 = secp256k1_test_state[1] << 0x11;
      uVar25 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
      uVar48 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
      secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar25;
      secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar48;
      secp256k1_test_state[2] = uVar25 ^ uVar22;
      secp256k1_test_state[3] = uVar48 << 0x2d | uVar48 >> 0x13;
      msg_00 = (code *)(uVar36 >> 0x3b);
      pbVar1 = (byte *)((long)&((secp256k1_schnorrsig_extraparams *)((long)msg_00 + 0x18))->noncefp
                       + (long)pubkey);
      *pbVar1 = *pbVar1 ^ bVar47;
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145440;
      iVar14 = secp256k1_schnorrsig_verify
                         (CTX,(uchar *)pubkey,(uchar *)unaff_RBP,0x20,
                          (secp256k1_xonly_pubkey *)psVar27);
      if (iVar14 != 0) goto LAB_001459c9;
      (((secp256k1_schnorrsig_extraparams *)msg_00)->magic + (long)pubkey->magic)[0x20] =
           (((secp256k1_schnorrsig_extraparams *)msg_00)->magic + (long)pubkey->magic)[0x20] ^
           bVar47;
      uVar36 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
               secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) + secp256k1_test_state[0];
      uVar22 = secp256k1_test_state[1] << 0x11;
      uVar25 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
      uVar48 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
      secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar25;
      secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar48;
      secp256k1_test_state[2] = uVar25 ^ uVar22;
      secp256k1_test_state[3] = uVar48 << 0x2d | uVar48 >> 0x13;
      msg_00 = (code *)(uVar36 >> 0x3b);
      ((secp256k1_schnorrsig_extraparams *)unaff_RBP)->magic
      [(long)((secp256k1_schnorrsig_extraparams *)msg_00)->magic] =
           ((secp256k1_schnorrsig_extraparams *)unaff_RBP)->magic
           [(long)((secp256k1_schnorrsig_extraparams *)msg_00)->magic] ^ bVar47;
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1454d3;
      iVar14 = secp256k1_schnorrsig_verify
                         (CTX,(uchar *)pubkey,(uchar *)unaff_RBP,0x20,
                          (secp256k1_xonly_pubkey *)psVar27);
      if (iVar14 != 0) goto LAB_001459ce;
      msg_00 = (code *)(((secp256k1_schnorrsig_extraparams *)unaff_RBP)->magic +
                       (long)((secp256k1_schnorrsig_extraparams *)msg_00)->magic);
      ((secp256k1_schnorrsig_extraparams *)msg_00)->magic[0] =
           ((secp256k1_schnorrsig_extraparams *)msg_00)->magic[0] ^ bVar47;
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1454fc;
      iVar14 = secp256k1_schnorrsig_verify
                         (CTX,(uchar *)pubkey,(uchar *)unaff_RBP,0x20,
                          (secp256k1_xonly_pubkey *)psVar27);
      if (iVar14 == 0) goto LAB_001459d3;
      pubkey = (secp256k1_schnorrsig_extraparams *)local_228;
      unaff_RBP = (code *)local_358;
      msg_00 = nonce_function_bip340;
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145540;
      iVar14 = secp256k1_schnorrsig_sign_internal
                         (CTX,(uchar *)pubkey,(uchar *)unaff_RBP,0x20,
                          (secp256k1_keypair *)keypair_00,nonce_function_bip340,(void *)0x0);
      if (iVar14 == 0) goto LAB_001459d8;
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145562;
      iVar14 = secp256k1_schnorrsig_verify
                         (CTX,(uchar *)pubkey,(uchar *)unaff_RBP,0x20,
                          (secp256k1_xonly_pubkey *)psVar27);
      if (iVar14 == 0) goto LAB_001459dd;
      pubkey_00 = (secp256k1_schnorrsig_extraparams *)(local_228 + 0x20);
      local_1f8 = (_func_void_char_ptr_void_ptr *)0xffffffffffffffff;
      pvStack_1f0 = (void *)0xffffffffffffffff;
      local_228._32_8_ = 0xffffffffffffffff;
      uStack_200 = 0xffffffffffffffff;
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x14559b;
      iVar14 = secp256k1_schnorrsig_verify
                         (CTX,(uchar *)pubkey,(uchar *)unaff_RBP,0x20,
                          (secp256k1_xonly_pubkey *)psVar27);
      if (iVar14 != 0) goto LAB_001459e2;
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1455c8;
      iVar14 = secp256k1_schnorrsig_sign_internal
                         (CTX,(uchar *)pubkey,(uchar *)unaff_RBP,0x20,
                          (secp256k1_keypair *)keypair_00,nonce_function_bip340,(void *)0x0);
      if (iVar14 == 0) goto LAB_001459e7;
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1455ea;
      iVar14 = secp256k1_schnorrsig_verify
                         (CTX,(uchar *)pubkey,(uchar *)unaff_RBP,0x20,
                          (secp256k1_xonly_pubkey *)psVar27);
      if (iVar14 == 0) goto LAB_001459ec;
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145607;
      secp256k1_scalar_set_b32((secp256k1_scalar *)&local_2f8,(uchar *)pubkey_00,(int *)0x0);
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145612;
      secp256k1_scalar_negate((secp256k1_scalar *)&local_2f8,(secp256k1_scalar *)&local_2f8);
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x14561d;
      secp256k1_scalar_get_b32((uchar *)pubkey_00,(secp256k1_scalar *)&local_2f8);
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145637;
      iVar14 = secp256k1_schnorrsig_verify
                         (CTX,(uchar *)pubkey,(uchar *)unaff_RBP,0x20,
                          (secp256k1_xonly_pubkey *)psVar27);
      msg_00 = (code *)&local_2f8;
      psVar45 = (secp256k1_schnorrsig_extraparams *)keypair_00;
      if (iVar14 != 0) goto LAB_001459f1;
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x14565b;
      iVar14 = secp256k1_schnorrsig_sign_custom
                         (CTX,(uchar *)pubkey,(uchar *)0x0,0,(secp256k1_keypair *)keypair_00,
                          (secp256k1_schnorrsig_extraparams *)0x0);
      if (iVar14 == 0) goto LAB_001459f6;
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145679;
      iVar14 = secp256k1_schnorrsig_verify
                         (CTX,(uchar *)pubkey,(uchar *)0x0,0,(secp256k1_xonly_pubkey *)psVar27);
      if (iVar14 == 0) goto LAB_001459fb;
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x14568b;
      uVar15 = testrand_int(0x100);
      unaff_RBP = (code *)(ulong)uVar15;
      uVar48 = 0xffffffffffffffe0;
      psVar27 = (secp256k1_context *)local_168;
      do {
        psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1456a9;
        testrand256(local_168 + uVar48 + 0x20);
        uVar48 = uVar48 + 0x20;
      } while (uVar48 < 0xe0);
      psVar41 = (secp256k1_schnorrsig_extraparams *)(ulong)uVar15;
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1456d4;
      iVar14 = secp256k1_schnorrsig_sign_custom
                         (CTX,(uchar *)pubkey,(uchar *)psVar27,(size_t)psVar41,
                          (secp256k1_keypair *)keypair_00,(secp256k1_schnorrsig_extraparams *)0x0);
      pubkey_00 = psVar41;
      if (iVar14 == 0) goto LAB_00145a00;
      pubkey_00 = (secp256k1_schnorrsig_extraparams *)local_398;
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1456f9;
      iVar14 = secp256k1_schnorrsig_verify
                         (CTX,(uchar *)pubkey,(uchar *)psVar27,(size_t)psVar41,
                          (secp256k1_xonly_pubkey *)pubkey_00);
      if (iVar14 == 0) goto LAB_00145a05;
      unaff_RBP = (code *)(ulong)(uVar15 - 1);
      psStack_410 = (secp256k1_schnorrsig_extraparams *)0x14571c;
      iVar14 = secp256k1_schnorrsig_verify
                         (CTX,(uchar *)pubkey,(uchar *)psVar27,(ulong)unaff_RBP & 0xff,
                          (secp256k1_xonly_pubkey *)pubkey_00);
      if (iVar14 != 0) goto LAB_00145a0a;
      uVar26 = (int)local_2b8._40_8_ + 1;
      local_2b8._40_8_ = ZEXT48(uVar26);
      unaff_RBP = nonce_function_bip340;
    } while ((int)uVar26 < COUNT);
  }
  psVar41 = (secp256k1_schnorrsig_extraparams *)local_168;
  pubkey = (secp256k1_schnorrsig_extraparams *)local_228;
  extraparams = (secp256k1_context *)local_398;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145766;
  testrand256((uchar *)extraparams);
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x14577d;
  iVar14 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)local_168,(uchar *)extraparams);
  if (iVar14 == 0) goto LAB_00145b59;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1457a3;
  iVar14 = secp256k1_keypair_xonly_pub
                     (CTX,(secp256k1_xonly_pubkey *)local_228,(int *)0x0,
                      (secp256k1_keypair *)local_168);
  if (iVar14 == 0) goto LAB_00145b5e;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1457c7;
  iVar14 = secp256k1_xonly_pubkey_serialize
                     (CTX,(uchar *)&(&local_2f8)[1].noncefp,(secp256k1_xonly_pubkey *)local_228);
  if (iVar14 == 0) goto LAB_00145b63;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1457eb;
  iVar14 = secp256k1_keypair_xonly_tweak_add
                     (CTX,(secp256k1_keypair *)local_168,(uchar *)&(&local_2f8)[1].noncefp);
  if (iVar14 != 1) goto LAB_00145b68;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145815;
  iVar14 = secp256k1_keypair_xonly_pub
                     (CTX,(secp256k1_xonly_pubkey *)local_358,(int *)&local_3b8,
                      (secp256k1_keypair *)local_168);
  if (iVar14 == 0) goto LAB_00145b6d;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145839;
  iVar14 = secp256k1_xonly_pubkey_serialize(CTX,local_2f8.magic,(secp256k1_xonly_pubkey *)local_358)
  ;
  if (iVar14 == 0) goto LAB_00145b72;
  extraparams = (secp256k1_context *)local_3d8;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x14584e;
  testrand256((uchar *)extraparams);
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145881;
  iVar14 = secp256k1_schnorrsig_sign_internal
                     (CTX,local_288,(uchar *)extraparams,0x20,(secp256k1_keypair *)local_168,
                      nonce_function_bip340,(void *)0x0);
  if (iVar14 == 0) goto LAB_00145b77;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1458a5;
  iVar14 = secp256k1_xonly_pubkey_parse(CTX,(secp256k1_xonly_pubkey *)local_358,local_2f8.magic);
  if (iVar14 == 0) goto LAB_00145b7c;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1458d3;
  iVar14 = secp256k1_schnorrsig_verify
                     (CTX,local_288,local_3d8,0x20,(secp256k1_xonly_pubkey *)local_358);
  if (iVar14 == 0) goto LAB_00145b81;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1458f7;
  iVar14 = secp256k1_xonly_pubkey_serialize(CTX,local_2b8,(secp256k1_xonly_pubkey *)local_228);
  if (iVar14 == 0) goto LAB_00145b86;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x14591b;
  iVar14 = secp256k1_xonly_pubkey_parse(CTX,(secp256k1_xonly_pubkey *)local_228,local_2b8);
  if (iVar14 == 0) goto LAB_00145b8b;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x14594b;
  iVar14 = secp256k1_xonly_pubkey_tweak_add_check
                     (CTX,local_2f8.magic,(int)local_3b8.magic,(secp256k1_xonly_pubkey *)local_228,
                      (uchar *)&(&local_2f8)[1].noncefp);
  if (iVar14 != 0) {
    return;
  }
  goto LAB_00145b90;
code_r0x00145cea:
  testrand256(auStack_480);
  iVar18 = secp256k1_musig_nonce_gen
                     (CTX,(secp256k1_musig_secnonce *)auStack_700,psVar39,auStack_480,puVar33,
                      psVar28,(uchar *)0x0,(secp256k1_musig_keyagg_cache *)0x0,(uchar *)0x0);
  psVar34 = (secp256k1_keyagg_cache_internal *)0x0;
  plVar38 = (long *)auStack_d38;
  puVar32 = auStack_db0 + 0x24;
  ppsVar31 = &psStack_d28;
  psVar28 = (secp256k1_pubkey *)(auStack_bb0 + 0x40);
  ppsVar46 = &psStack_d18;
  psVar24 = (secp256k1_keyagg_cache_internal *)auStack_a00;
  puVar33 = auStack_bd0;
  psVar29 = &sStack_67c;
  psVar37 = &sStack_67c;
  psVar39 = (secp256k1_musig_pubnonce *)auStack_8bc;
  if (iVar18 != 1) {
LAB_00147a41:
    run_musig_tests_cold_98();
    goto LAB_00147a46;
  }
  goto LAB_00145c52;
LAB_00147a46:
  psVar29 = psVar34;
  run_musig_tests_cold_93();
LAB_00147a4b:
  run_musig_tests_cold_1();
LAB_00147a50:
  run_musig_tests_cold_4();
LAB_00147a55:
  run_musig_tests_cold_5();
LAB_00147a5a:
  run_musig_tests_cold_82();
LAB_00147a5f:
  run_musig_tests_cold_21();
LAB_00147a64:
  run_musig_tests_cold_91();
LAB_00147a69:
  run_musig_tests_cold_87();
LAB_00147a6e:
  run_musig_tests_cold_88();
LAB_00147a73:
  run_musig_tests_cold_86();
LAB_00147a78:
  run_musig_tests_cold_69();
LAB_00147a7d:
  run_musig_tests_cold_6();
LAB_00147a82:
  psVar24 = psVar29;
  run_musig_tests_cold_8();
LAB_00147a87:
  run_musig_tests_cold_7();
LAB_00147a8c:
  run_musig_tests_cold_40();
  psVar29 = psVar24;
LAB_00147a91:
  run_musig_tests_cold_3();
LAB_00147a96:
  run_musig_tests_cold_85();
LAB_00147a9b:
  run_musig_tests_cold_97();
LAB_00147aa0:
  run_musig_tests_cold_96();
LAB_00147aa5:
  run_musig_tests_cold_95();
LAB_00147aaa:
  run_musig_tests_cold_94();
LAB_00147aaf:
  run_musig_tests_cold_11();
LAB_00147ab4:
  run_musig_tests_cold_12();
  psVar24 = psVar29;
LAB_00147ab9:
  psVar29 = psVar24;
  run_musig_tests_cold_2();
LAB_00147abe:
  run_musig_tests_cold_92();
LAB_00147ac3:
  run_musig_tests_cold_84();
LAB_00147ac8:
  run_musig_tests_cold_15();
LAB_00147acd:
  run_musig_tests_cold_83();
LAB_00147ad2:
  run_musig_tests_cold_81();
LAB_00147ad7:
  run_musig_tests_cold_80();
LAB_00147adc:
  run_musig_tests_cold_14();
LAB_00147ae1:
  run_musig_tests_cold_13();
LAB_00147ae6:
  run_musig_tests_cold_9();
LAB_00147aeb:
  run_musig_tests_cold_90();
LAB_00147af0:
  run_musig_tests_cold_89();
LAB_00147af5:
  run_musig_tests_cold_79();
LAB_00147afa:
  run_musig_tests_cold_78();
LAB_00147aff:
  run_musig_tests_cold_77();
LAB_00147b04:
  run_musig_tests_cold_76();
LAB_00147b09:
  run_musig_tests_cold_75();
LAB_00147b0e:
  run_musig_tests_cold_74();
LAB_00147b13:
  run_musig_tests_cold_73();
LAB_00147b18:
  run_musig_tests_cold_72();
LAB_00147b1d:
  run_musig_tests_cold_71();
LAB_00147b22:
  run_musig_tests_cold_70();
LAB_00147b27:
  run_musig_tests_cold_23();
LAB_00147b2c:
  run_musig_tests_cold_68();
LAB_00147b31:
  run_musig_tests_cold_67();
LAB_00147b36:
  run_musig_tests_cold_66();
LAB_00147b3b:
  run_musig_tests_cold_65();
  psVar24 = psVar29;
LAB_00147b40:
  run_musig_tests_cold_32();
LAB_00147b45:
  run_musig_tests_cold_34();
LAB_00147b4a:
  run_musig_tests_cold_62();
LAB_00147b4f:
  run_musig_tests_cold_61();
LAB_00147b54:
  run_musig_tests_cold_60();
LAB_00147b59:
  run_musig_tests_cold_59();
LAB_00147b5e:
  run_musig_tests_cold_58();
LAB_00147b63:
  psVar29 = psVar24;
  run_musig_tests_cold_57();
LAB_00147b68:
  run_musig_tests_cold_56();
  psVar24 = psVar29;
LAB_00147b6d:
  run_musig_tests_cold_25();
LAB_00147b72:
  run_musig_tests_cold_55();
LAB_00147b77:
  run_musig_tests_cold_54();
LAB_00147b7c:
  run_musig_tests_cold_53();
LAB_00147b81:
  run_musig_tests_cold_41();
LAB_00147b86:
  psVar29 = psVar24;
  run_musig_tests_cold_52();
LAB_00147b8b:
  run_musig_tests_cold_51();
LAB_00147b90:
  run_musig_tests_cold_36();
LAB_00147b95:
  run_musig_tests_cold_50();
LAB_00147b9a:
  run_musig_tests_cold_33();
  psVar24 = psVar29;
LAB_00147b9f:
  run_musig_tests_cold_24();
LAB_00147ba4:
  run_musig_tests_cold_35();
LAB_00147ba9:
  run_musig_tests_cold_31();
LAB_00147bae:
  run_musig_tests_cold_30();
  psVar29 = psVar24;
LAB_00147bb3:
  run_musig_tests_cold_10();
LAB_00147bb8:
  run_musig_tests_cold_16();
LAB_00147bbd:
  run_musig_tests_cold_17();
LAB_00147bc2:
  run_musig_tests_cold_18();
LAB_00147bc7:
  run_musig_tests_cold_19();
LAB_00147bcc:
  run_musig_tests_cold_20();
LAB_00147bd1:
  run_musig_tests_cold_29();
LAB_00147bd6:
  run_musig_tests_cold_26();
LAB_00147bdb:
  run_musig_tests_cold_27();
LAB_00147be0:
  run_musig_tests_cold_28();
  psVar24 = psVar29;
LAB_00147be5:
  run_musig_tests_cold_22();
LAB_00147bea:
  run_musig_tests_cold_37();
LAB_00147bef:
  run_musig_tests_cold_42();
  goto LAB_00147bf4;
LAB_0014596f:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145974;
  run_schnorrsig_tests_cold_115();
  extraparams = psVar27;
LAB_00145974:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145979;
  run_schnorrsig_tests_cold_113();
LAB_00145979:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x14597e;
  run_schnorrsig_tests_cold_82();
  msg_00 = (code *)psVar41;
LAB_0014597e:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145983;
  run_schnorrsig_tests_cold_81();
LAB_00145983:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145988;
  run_schnorrsig_tests_cold_80();
LAB_00145988:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x14598d;
  run_schnorrsig_tests_cold_79();
LAB_0014598d:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145992;
  run_schnorrsig_tests_cold_78();
LAB_00145992:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145997;
  run_schnorrsig_tests_cold_77();
LAB_00145997:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x14599c;
  run_schnorrsig_tests_cold_76();
LAB_0014599c:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1459a1;
  run_schnorrsig_tests_cold_36();
  psVar41 = (secp256k1_schnorrsig_extraparams *)msg_00;
LAB_001459a1:
  msg_00 = (code *)psVar41;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1459a6;
  run_schnorrsig_tests_cold_38();
LAB_001459a6:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1459ab;
  run_schnorrsig_tests_cold_75();
  psVar27 = extraparams;
LAB_001459ab:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1459b0;
  run_schnorrsig_tests_cold_74();
LAB_001459b0:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1459b5;
  run_schnorrsig_tests_cold_73();
LAB_001459b5:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1459ba;
  run_schnorrsig_tests_cold_72();
LAB_001459ba:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1459bf;
  run_schnorrsig_tests_cold_71();
LAB_001459bf:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1459c4;
  run_schnorrsig_tests_cold_70();
LAB_001459c4:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1459c9;
  run_schnorrsig_tests_cold_41();
LAB_001459c9:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1459ce;
  run_schnorrsig_tests_cold_42();
LAB_001459ce:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1459d3;
  run_schnorrsig_tests_cold_43();
LAB_001459d3:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1459d8;
  run_schnorrsig_tests_cold_67();
LAB_001459d8:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1459dd;
  run_schnorrsig_tests_cold_66();
LAB_001459dd:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1459e2;
  run_schnorrsig_tests_cold_65();
LAB_001459e2:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1459e7;
  run_schnorrsig_tests_cold_44();
LAB_001459e7:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1459ec;
  run_schnorrsig_tests_cold_64();
LAB_001459ec:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1459f1;
  run_schnorrsig_tests_cold_63();
  psVar45 = (secp256k1_schnorrsig_extraparams *)keypair_00;
LAB_001459f1:
  keypair_00 = msg_00;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1459f6;
  run_schnorrsig_tests_cold_45();
LAB_001459f6:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x1459fb;
  run_schnorrsig_tests_cold_62();
LAB_001459fb:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145a00;
  run_schnorrsig_tests_cold_61();
LAB_00145a00:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145a05;
  run_schnorrsig_tests_cold_60();
LAB_00145a05:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145a0a;
  run_schnorrsig_tests_cold_59();
LAB_00145a0a:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145a0f;
  run_schnorrsig_tests_cold_46();
  psVar41 = (secp256k1_schnorrsig_extraparams *)keypair_00;
  keypair_00 = (code *)psVar45;
LAB_00145a0f:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145a14;
  run_schnorrsig_tests_cold_114();
LAB_00145a14:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145a19;
  run_schnorrsig_tests_cold_112();
LAB_00145a19:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145a1e;
  run_schnorrsig_tests_cold_117();
LAB_00145a1e:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145a23;
  run_schnorrsig_tests_cold_116();
LAB_00145a23:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145a28;
  run_schnorrsig_tests_cold_111();
  extraparams = psVar27;
LAB_00145a28:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145a2d;
  run_schnorrsig_tests_cold_110();
LAB_00145a2d:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145a32;
  run_schnorrsig_tests_cold_109();
LAB_00145a32:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145a37;
  run_schnorrsig_tests_cold_108();
LAB_00145a37:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145a3c;
  run_schnorrsig_tests_cold_107();
LAB_00145a3c:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145a41;
  run_schnorrsig_tests_cold_106();
LAB_00145a41:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145a46;
  run_schnorrsig_tests_cold_105();
LAB_00145a46:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145a4b;
  run_schnorrsig_tests_cold_104();
LAB_00145a4b:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145a50;
  run_schnorrsig_tests_cold_103();
LAB_00145a50:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145a55;
  run_schnorrsig_tests_cold_102();
LAB_00145a55:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145a5a;
  run_schnorrsig_tests_cold_2();
LAB_00145a5a:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145a5f;
  run_schnorrsig_tests_cold_3();
LAB_00145a5f:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145a64;
  run_schnorrsig_tests_cold_101();
LAB_00145a64:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145a69;
  run_schnorrsig_tests_cold_4();
LAB_00145a69:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145a6e;
  run_schnorrsig_tests_cold_5();
LAB_00145a6e:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145a73;
  run_schnorrsig_tests_cold_100();
LAB_00145a73:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145a78;
  run_schnorrsig_tests_cold_6();
LAB_00145a78:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145a7d;
  run_schnorrsig_tests_cold_7();
LAB_00145a7d:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145a82;
  run_schnorrsig_tests_cold_99();
LAB_00145a82:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145a87;
  run_schnorrsig_tests_cold_8();
LAB_00145a87:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145a8c;
  run_schnorrsig_tests_cold_9();
LAB_00145a8c:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145a91;
  run_schnorrsig_tests_cold_98();
LAB_00145a91:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145a96;
  run_schnorrsig_tests_cold_10();
LAB_00145a96:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145a9b;
  run_schnorrsig_tests_cold_11();
LAB_00145a9b:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145aa0;
  run_schnorrsig_tests_cold_97();
LAB_00145aa0:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145aa5;
  run_schnorrsig_tests_cold_96();
LAB_00145aa5:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145aaa;
  run_schnorrsig_tests_cold_12();
LAB_00145aaa:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145aaf;
  run_schnorrsig_tests_cold_13();
LAB_00145aaf:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145ab4;
  run_schnorrsig_tests_cold_95();
LAB_00145ab4:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145ab9;
  run_schnorrsig_tests_cold_14();
LAB_00145ab9:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145abe;
  run_schnorrsig_tests_cold_15();
LAB_00145abe:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145ac3;
  run_schnorrsig_tests_cold_94();
LAB_00145ac3:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145ac8;
  run_schnorrsig_tests_cold_93();
LAB_00145ac8:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145acd;
  run_schnorrsig_tests_cold_16();
LAB_00145acd:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145ad2;
  run_schnorrsig_tests_cold_17();
LAB_00145ad2:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145ad7;
  run_schnorrsig_tests_cold_92();
LAB_00145ad7:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145adc;
  run_schnorrsig_tests_cold_18();
LAB_00145adc:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145ae1;
  run_schnorrsig_tests_cold_19();
LAB_00145ae1:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145ae6;
  run_schnorrsig_tests_cold_91();
LAB_00145ae6:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145aeb;
  run_schnorrsig_tests_cold_90();
LAB_00145aeb:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145af0;
  run_schnorrsig_tests_cold_20();
LAB_00145af0:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145af5;
  run_schnorrsig_tests_cold_21();
LAB_00145af5:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145afa;
  run_schnorrsig_tests_cold_89();
LAB_00145afa:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145aff;
  run_schnorrsig_tests_cold_22();
LAB_00145aff:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145b04;
  run_schnorrsig_tests_cold_23();
LAB_00145b04:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145b09;
  run_schnorrsig_tests_cold_88();
LAB_00145b09:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145b0e;
  run_schnorrsig_tests_cold_87();
LAB_00145b0e:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145b13;
  run_schnorrsig_tests_cold_86();
LAB_00145b13:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145b18;
  run_schnorrsig_tests_cold_24();
LAB_00145b18:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145b1d;
  run_schnorrsig_tests_cold_25();
LAB_00145b1d:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145b22;
  run_schnorrsig_tests_cold_85();
LAB_00145b22:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145b27;
  run_schnorrsig_tests_cold_26();
LAB_00145b27:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145b2c;
  run_schnorrsig_tests_cold_27();
LAB_00145b2c:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145b31;
  run_schnorrsig_tests_cold_28();
LAB_00145b31:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145b36;
  run_schnorrsig_tests_cold_84();
LAB_00145b36:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145b3b;
  run_schnorrsig_tests_cold_29();
LAB_00145b3b:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145b40;
  run_schnorrsig_tests_cold_30();
LAB_00145b40:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145b45;
  run_schnorrsig_tests_cold_83();
LAB_00145b45:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145b4a;
  run_schnorrsig_tests_cold_31();
LAB_00145b4a:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145b4f;
  run_schnorrsig_tests_cold_32();
LAB_00145b4f:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145b54;
  run_schnorrsig_tests_cold_33();
LAB_00145b54:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145b59;
  run_schnorrsig_tests_cold_34();
LAB_00145b59:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145b5e;
  run_schnorrsig_tests_cold_58();
LAB_00145b5e:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145b63;
  run_schnorrsig_tests_cold_57();
LAB_00145b63:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145b68;
  run_schnorrsig_tests_cold_56();
LAB_00145b68:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145b6d;
  run_schnorrsig_tests_cold_47();
LAB_00145b6d:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145b72;
  run_schnorrsig_tests_cold_55();
LAB_00145b72:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145b77;
  run_schnorrsig_tests_cold_54();
LAB_00145b77:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145b7c;
  run_schnorrsig_tests_cold_53();
LAB_00145b7c:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145b81;
  run_schnorrsig_tests_cold_52();
LAB_00145b81:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145b86;
  run_schnorrsig_tests_cold_51();
LAB_00145b86:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145b8b;
  run_schnorrsig_tests_cold_50();
LAB_00145b8b:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145b90;
  run_schnorrsig_tests_cold_49();
LAB_00145b90:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145b95;
  run_schnorrsig_tests_cold_48();
LAB_00145b95:
  msg_00 = (code *)pubkey_00;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145b9a;
  run_schnorrsig_tests_cold_35();
LAB_00145b9a:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145b9f;
  run_schnorrsig_tests_cold_37();
  psVar27 = extraparams;
  pubkey_00 = (secp256k1_schnorrsig_extraparams *)msg_00;
LAB_00145b9f:
  msg_00 = (code *)psVar41;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145ba4;
  run_schnorrsig_tests_cold_39();
LAB_00145ba4:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)0x145ba9;
  run_schnorrsig_tests_cold_40();
  psVar41 = (secp256k1_schnorrsig_extraparams *)msg_00;
LAB_00145ba9:
  psStack_410 = (secp256k1_schnorrsig_extraparams *)run_musig_tests;
  run_schnorrsig_tests_cold_1();
  psStack_438 = psVar27;
  psStack_430 = pubkey;
  psStack_428 = psVar41;
  psStack_420 = (secp256k1_schnorrsig_extraparams *)keypair_00;
  psStack_418 = pubkey_00;
  psStack_410 = (secp256k1_schnorrsig_extraparams *)unaff_RBP;
  if (0 < COUNT) {
    iVar14 = 0;
    do {
      psVar28 = (secp256k1_pubkey *)auStack_bb0;
      plVar38 = (long *)auStack_d40;
      testrand256(auStack_9a0 + 0x40);
      psVar34 = (secp256k1_keyagg_cache_internal *)0x1;
      puVar32 = auStack_db0;
      ppsVar31 = (secp256k1_pubkey **)auStack_d30;
      ppsVar46 = &psStack_d20;
      psVar24 = (secp256k1_keyagg_cache_internal *)auStack_a60;
      puVar33 = auStack_c80 + 0x90;
      psVar29 = (secp256k1_keyagg_cache_internal *)auStack_700;
      psVar39 = (secp256k1_musig_pubnonce *)auStack_940;
LAB_00145c52:
      testrand256(puVar33);
      *ppsVar31 = psVar28;
      *ppsVar46 = psVar39;
      *plVar38 = (long)puVar32;
      psVar35 = (secp256k1_keyagg_cache_internal *)auStack_b30;
      uVar26 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)psVar35,puVar33);
      uVar17 = secp256k1_keypair_pub(CTX,psVar28,(secp256k1_keypair *)psVar35);
      psVar37 = psVar24;
      memcpy(psVar24,psVar35,0x60);
      if ((uVar17 & uVar26) == 0) {
        run_musig_tests_cold_99();
        psVar34 = psVar35;
        goto LAB_00147a41;
      }
      if (psVar34 != (secp256k1_keyagg_cache_internal *)0x0) goto code_r0x00145cea;
      psVar37 = (secp256k1_keyagg_cache_internal *)CTX;
      iVar18 = secp256k1_musig_nonce_gen_counter
                         (CTX,(secp256k1_musig_secnonce *)psVar29,psVar39,0,
                          (secp256k1_keypair *)psVar24,(uchar *)0x0,
                          (secp256k1_musig_keyagg_cache *)0x0,(uchar *)0x0);
      if (iVar18 == 0) goto LAB_00147a9b;
      psVar29 = (secp256k1_keyagg_cache_internal *)auStack_9a0;
      psVar37 = (secp256k1_keyagg_cache_internal *)CTX;
      iVar18 = secp256k1_musig_pubkey_agg
                         (CTX,(secp256k1_xonly_pubkey *)psVar29,
                          (secp256k1_musig_keyagg_cache *)auStack_b30,
                          (secp256k1_pubkey **)auStack_d30,2);
      if (iVar18 == 0) goto LAB_00147aa0;
      psVar29 = (secp256k1_keyagg_cache_internal *)auStack_c80;
      psVar37 = (secp256k1_keyagg_cache_internal *)CTX;
      iVar18 = secp256k1_musig_nonce_agg(CTX,(secp256k1_musig_aggnonce *)auStack_c80,&psStack_d20,2)
      ;
      if (iVar18 == 0) goto LAB_00147aa5;
      psVar29 = (secp256k1_keyagg_cache_internal *)auStack_d10;
      psVar37 = (secp256k1_keyagg_cache_internal *)CTX;
      iVar18 = secp256k1_musig_nonce_process
                         (CTX,(secp256k1_musig_session *)psVar29,
                          (secp256k1_musig_aggnonce *)auStack_c80,auStack_9a0 + 0x40,
                          (secp256k1_musig_keyagg_cache *)auStack_b30);
      if (iVar18 == 0) goto LAB_00147aaa;
      psVar29 = (secp256k1_keyagg_cache_internal *)auStack_db0;
      psVar28 = (secp256k1_pubkey *)auStack_bb0;
      keypair = (secp256k1_keypair *)auStack_a60;
      psVar24 = (secp256k1_keyagg_cache_internal *)auStack_700;
      psVar39 = (secp256k1_musig_pubnonce *)auStack_940;
      bVar13 = true;
      do {
        bVar30 = bVar13;
        psVar34 = psVar29;
        psVar37 = (secp256k1_keyagg_cache_internal *)CTX;
        iVar18 = secp256k1_musig_partial_sign
                           (CTX,(secp256k1_musig_partial_sig *)psVar29,
                            (secp256k1_musig_secnonce *)psVar24,keypair,
                            (secp256k1_musig_keyagg_cache *)auStack_b30,
                            (secp256k1_musig_session *)auStack_d10);
        if (iVar18 == 0) goto LAB_00147a46;
        psVar37 = (secp256k1_keyagg_cache_internal *)CTX;
        iVar18 = secp256k1_musig_partial_sig_verify
                           (CTX,(secp256k1_musig_partial_sig *)psVar29,psVar39,psVar28,
                            (secp256k1_musig_keyagg_cache *)auStack_b30,
                            (secp256k1_musig_session *)auStack_d10);
        if (iVar18 != 1) goto LAB_00147a4b;
        psVar29 = (secp256k1_keyagg_cache_internal *)(auStack_db0 + 0x24);
        psVar28 = (secp256k1_pubkey *)(auStack_bb0 + 0x40);
        keypair = (secp256k1_keypair *)auStack_a00;
        psVar24 = &sStack_67c;
        psVar39 = (secp256k1_musig_pubnonce *)auStack_8bc;
        bVar13 = false;
      } while (bVar30);
      psVar29 = (secp256k1_keyagg_cache_internal *)&stack0xfffffffffffffb40;
      psVar24 = psVar29;
      psVar37 = (secp256k1_keyagg_cache_internal *)CTX;
      iVar18 = secp256k1_musig_partial_sig_agg
                         (CTX,(uchar *)psVar29,(secp256k1_musig_session *)auStack_d10,
                          (secp256k1_musig_partial_sig **)auStack_d40,2);
      if (iVar18 != 1) goto LAB_00147ab9;
      psVar37 = (secp256k1_keyagg_cache_internal *)CTX;
      iVar18 = secp256k1_schnorrsig_verify
                         (CTX,(uchar *)psVar29,auStack_9a0 + 0x40,0x20,
                          (secp256k1_xonly_pubkey *)auStack_9a0);
      if (iVar18 == 0) goto LAB_00147abe;
      iVar14 = iVar14 + 1;
    } while (iVar14 < COUNT);
  }
  musig_api_tests();
  testrand_bytes_test(auStack_a60,0x20);
  testrand_bytes_test(auStack_d10,0x20);
  testrand_bytes_test(auStack_b30,0x21);
  testrand_bytes_test(auStack_c80,0x20);
  testrand_bytes_test(auStack_bb0,0x20);
  testrand_bytes_test(auStack_db0,0x20);
  auStack_700._0_8_ = auStack_a60;
  auStack_700._8_8_ = auStack_c80;
  auStack_700._16_8_ = auStack_d10;
  auStack_700._24_8_ = auStack_b30;
  auStack_700._32_8_ = auStack_bb0;
  auStack_700._40_8_ = auStack_db0;
  if (0 < COUNT) {
    iVar14 = 0;
    do {
      musig_nonce_bitflip((uchar **)auStack_700,0,0x20);
      musig_nonce_bitflip((uchar **)auStack_700,1,0x20);
      musig_nonce_bitflip((uchar **)auStack_700,2,0x20);
      musig_nonce_bitflip((uchar **)auStack_700,3,0x21);
      musig_nonce_bitflip((uchar **)auStack_700,4,0x20);
      musig_nonce_bitflip((uchar **)auStack_700,5,0x20);
      iVar14 = iVar14 + 1;
    } while (iVar14 < COUNT);
  }
  psStack_d48 = (secp256k1_keyagg_cache_internal *)auStack_8bc;
  auStack_c80._16_8_ = auStack_a60._16_8_;
  auStack_c80._24_8_ = auStack_a60._24_8_;
  auStack_c80._0_8_ = auStack_a60._0_8_;
  auStack_c80._8_8_ = auStack_a60._8_8_;
  auStack_d10._0_8_ = auStack_a60._0_8_;
  auStack_d10._8_8_ = auStack_a60._8_8_;
  auStack_d10._16_8_ = auStack_a60._16_8_;
  auStack_d10._24_8_ = auStack_a60._24_8_;
  auStack_b30._0_8_ = auStack_a60._0_8_;
  auStack_b30._8_8_ = auStack_a60._8_8_;
  auStack_b30._16_8_ = auStack_a60._16_8_;
  auStack_b30._24_8_ = auStack_a60._24_8_;
  auStack_bb0._0_8_ = auStack_a60._0_8_;
  auStack_bb0._8_8_ = auStack_a60._8_8_;
  auStack_bb0._16_8_ = auStack_a60._16_8_;
  auStack_bb0._24_8_ = auStack_a60._24_8_;
  auStack_db0._0_8_ = auStack_a60._0_8_;
  auStack_db0._8_8_ = auStack_a60._8_8_;
  auStack_db0._16_8_ = auStack_a60._16_8_;
  auStack_db0._24_8_ = auStack_a60._24_8_;
  secp256k1_nonce_function_musig
            ((secp256k1_scalar *)auStack_940,auStack_a60,auStack_c80,auStack_d10,auStack_b30,
             auStack_bb0,auStack_db0);
  secp256k1_nonce_function_musig
            ((secp256k1_scalar *)auStack_900,auStack_a60,(uchar *)0x0,auStack_d10,auStack_b30,
             auStack_bb0,auStack_db0);
  secp256k1_nonce_function_musig
            ((secp256k1_scalar *)(auStack_900 + 0x40),auStack_a60,auStack_c80,(uchar *)0x0,
             auStack_b30,auStack_bb0,auStack_db0);
  secp256k1_nonce_function_musig
            ((secp256k1_scalar *)(auStack_8bc + 0x3c),auStack_a60,auStack_c80,auStack_d10,
             (uchar *)0x0,auStack_bb0,auStack_db0);
  psVar24 = (secp256k1_keyagg_cache_internal *)auStack_900;
  secp256k1_nonce_function_musig
            (asStack_840,auStack_a60,auStack_c80,auStack_d10,auStack_b30,(uchar *)0x0,auStack_db0);
  uVar48 = 0;
  secp256k1_nonce_function_musig
            (asStack_800,auStack_a60,auStack_c80,auStack_d10,auStack_b30,auStack_bb0,(uchar *)0x0);
  uVar42 = 5;
  do {
    lVar20 = uVar48 * 0x40;
    r = (secp256k1_scalar *)(auStack_91c + lVar20 + -4);
    secp256k1_scalar_verify((secp256k1_scalar *)(auStack_940 + lVar20));
    secp256k1_scalar_verify(r);
    uVar3 = *(uint64_t *)(auStack_940 + lVar20);
    uVar4 = *(uint64_t *)(auStack_940 + lVar20 + 8);
    uVar5 = r->d[0];
    uVar6 = *(uint64_t *)(auStack_91c + lVar20 + 4);
    psVar34 = *(secp256k1_keyagg_cache_internal **)(auStack_940 + lVar20 + 0x10);
    psVar35 = *(secp256k1_keyagg_cache_internal **)(auStack_91c + lVar20 + 0xc);
    uVar7 = *(uint64_t *)(auStack_91c + lVar20 + -0xc);
    uVar8 = *(uint64_t *)(auStack_900 + lVar20 + -8);
    psVar29 = psVar34;
    psVar37 = psVar35;
    if (uVar7 == uVar8 && (psVar34 == psVar35 && (uVar4 == uVar6 && uVar3 == uVar5)))
    goto LAB_00147a91;
    uStack_d60 = uVar42;
    uStack_d58 = uVar48;
    psStack_d50 = psVar24;
    if (uVar48 < 5) {
      do {
        secp256k1_scalar_verify((secp256k1_scalar *)(auStack_940 + lVar20));
        psVar37 = psVar24;
        secp256k1_scalar_verify((secp256k1_scalar *)psVar24);
        if ((((uVar3 == *(uint64_t *)&psVar24->pk) &&
             (uVar4 == (((secp256k1_ecmult_gen_context *)&psVar24->pk)->scalar_offset).d[0])) &&
            (psVar34 ==
             (secp256k1_keyagg_cache_internal *)
             (((secp256k1_ecmult_gen_context *)&psVar24->pk)->scalar_offset).d[1])) &&
           (uVar7 == (((secp256k1_ecmult_gen_context *)&psVar24->pk)->scalar_offset).d[2]))
        goto LAB_00147a50;
        psVar37 = (secp256k1_keyagg_cache_internal *)
                  ((((secp256k1_ecmult_gen_context *)&psVar24->pk)->scalar_offset).d + 3);
        secp256k1_scalar_verify(r);
        secp256k1_scalar_verify((secp256k1_scalar *)psVar37);
        if (((uVar5 == (((secp256k1_ecmult_gen_context *)&psVar24->pk)->scalar_offset).d[3]) &&
            (uVar6 == (((secp256k1_ecmult_gen_context *)&psVar24->pk)->ge_offset).x.n[0])) &&
           ((psVar35 ==
             (secp256k1_keyagg_cache_internal *)
             (((secp256k1_ecmult_gen_context *)&psVar24->pk)->ge_offset).x.n[1] &&
            (uVar8 == (((secp256k1_ecmult_gen_context *)&psVar24->pk)->ge_offset).x.n[2]))))
        goto LAB_00147a55;
        psVar24 = (secp256k1_keyagg_cache_internal *)
                  ((((secp256k1_ecmult_gen_context *)&psVar24->pk)->ge_offset).x.n + 3);
        uVar42 = uVar42 - 1;
      } while (uVar42 != 0);
    }
    uVar48 = uStack_d58 + 1;
    uVar42 = uStack_d60 - 1;
    psVar24 = (secp256k1_keyagg_cache_internal *)
              ((((secp256k1_ecmult_gen_context *)&psStack_d50->pk)->ge_offset).x.n + 3);
  } while (uVar48 != 6);
  if (0 < COUNT) {
    iVar14 = 0;
    do {
      puVar21 = (undefined8 *)auStack_db0;
      psVar29 = (secp256k1_keyagg_cache_internal *)auStack_a60;
      puVar33 = auStack_d10;
      bVar13 = true;
      do {
        bVar30 = bVar13;
        *puVar21 = psVar29;
        testrand256(puVar33);
        uVar26 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)auStack_700,puVar33);
        psVar37 = (secp256k1_keyagg_cache_internal *)CTX;
        uVar17 = secp256k1_keypair_pub
                           (CTX,(secp256k1_pubkey *)psVar29,(secp256k1_keypair *)auStack_700);
        if ((uVar17 & uVar26) == 0) goto LAB_00147a64;
        puVar21 = (undefined8 *)(auStack_db0 + 8);
        psVar29 = (secp256k1_keyagg_cache_internal *)(auStack_a60 + 0x40);
        puVar33 = auStack_d10 + 0x20;
        bVar13 = false;
      } while (bVar30);
      psVar29 = (secp256k1_keyagg_cache_internal *)auStack_700;
      psVar37 = (secp256k1_keyagg_cache_internal *)CTX;
      iVar18 = secp256k1_musig_pubkey_agg
                         (CTX,(secp256k1_xonly_pubkey *)auStack_700,
                          (secp256k1_musig_keyagg_cache *)auStack_b30,
                          (secp256k1_pubkey **)auStack_db0,2);
      if (iVar18 == 0) goto LAB_00147aeb;
      musig_tweak_test_helper
                ((secp256k1_xonly_pubkey *)auStack_700,auStack_d10,auStack_d10 + 0x20,
                 (secp256k1_musig_keyagg_cache *)auStack_b30);
      psVar29 = (secp256k1_keyagg_cache_internal *)auStack_940;
      psVar37 = (secp256k1_keyagg_cache_internal *)CTX;
      iVar18 = secp256k1_musig_pubkey_get
                         (CTX,(secp256k1_pubkey *)psVar29,
                          (secp256k1_musig_keyagg_cache *)auStack_b30);
      if (iVar18 == 0) goto LAB_00147af0;
      lVar20 = 1;
      puVar32 = auStack_900;
      do {
        uVar42 = secp256k1_test_state[0];
        uVar48 = secp256k1_test_state[3] + secp256k1_test_state[0];
        uVar25 = secp256k1_test_state[1] << 0x11;
        uVar36 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
        uVar22 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
        secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar36;
        secp256k1_test_state[0] = uVar22 ^ secp256k1_test_state[0];
        secp256k1_test_state[2] = uVar36 ^ uVar25;
        secp256k1_test_state[3] = uVar22 << 0x2d | uVar22 >> 0x13;
        testrand256(auStack_bb0);
        lVar40 = lVar20 * 0x40;
        lVar43 = (uVar48 * 0x800000 | uVar48 >> 0x29) + uVar42;
        psVar24 = (secp256k1_keyagg_cache_internal *)(auStack_940 + lVar40);
        psVar37 = (secp256k1_keyagg_cache_internal *)CTX;
        psVar29 = psVar24;
        if (lVar43 < 0) {
          iVar18 = secp256k1_musig_pubkey_tweak_add_internal
                             (CTX,(secp256k1_pubkey *)psVar24,
                              (secp256k1_musig_keyagg_cache *)auStack_b30,auStack_bb0,1);
          if (iVar18 == 0) goto LAB_00147a7d;
        }
        else {
          iVar18 = secp256k1_musig_pubkey_tweak_add_internal
                             (CTX,(secp256k1_pubkey *)psVar24,
                              (secp256k1_musig_keyagg_cache *)auStack_b30,auStack_bb0,0);
          if (iVar18 == 0) goto LAB_00147a6e;
        }
        psVar34 = (secp256k1_keyagg_cache_internal *)(auStack_700 + lVar40);
        psVar29 = psVar34;
        psVar37 = (secp256k1_keyagg_cache_internal *)CTX;
        iVar18 = secp256k1_xonly_pubkey_from_pubkey
                           (CTX,(secp256k1_xonly_pubkey *)psVar34,(int *)(auStack_c80 + 0x90),
                            (secp256k1_pubkey *)psVar24);
        if (iVar18 == 0) goto LAB_00147a69;
        psVar37 = (secp256k1_keyagg_cache_internal *)CTX;
        if (lVar43 < 0) {
          psVar24 = (secp256k1_keyagg_cache_internal *)auStack_c80;
          psVar29 = psVar24;
          iVar18 = secp256k1_xonly_pubkey_serialize
                             (CTX,(uchar *)psVar24,(secp256k1_xonly_pubkey *)psVar34);
          if (iVar18 == 0) goto LAB_00147a82;
          psVar37 = (secp256k1_keyagg_cache_internal *)CTX;
          iVar18 = secp256k1_xonly_pubkey_tweak_add_check
                             (CTX,(uchar *)psVar24,auStack_c80._144_4_,&sStack_740 + lVar20,
                              auStack_bb0);
          if (iVar18 == 0) goto LAB_00147a87;
        }
        else {
          auStack_c80._0_8_ = *(undefined8 *)(auStack_9a0 + lVar40 + 0x20);
          auStack_c80._8_8_ = *(undefined8 *)(auStack_9a0 + lVar40 + 0x28);
          auStack_c80._16_8_ = *(undefined8 *)(auStack_9a0 + lVar40 + 0x30);
          auStack_c80._24_8_ = *(undefined8 *)(auStack_940 + lVar40 + -0x28);
          auStack_c80._32_8_ = *(undefined8 *)(auStack_940 + lVar40 + -0x20);
          auStack_c80._40_8_ = *(undefined8 *)(auStack_940 + lVar40 + -0x18);
          auStack_c80._48_8_ = *(undefined8 *)(auStack_940 + lVar40 + -0x10);
          auStack_c80._56_8_ = *(undefined8 *)(auStack_940 + lVar40 + -8);
          psVar29 = (secp256k1_keyagg_cache_internal *)auStack_c80;
          iVar18 = secp256k1_ec_pubkey_tweak_add(CTX,(secp256k1_pubkey *)psVar29,auStack_bb0);
          if (iVar18 == 0) goto LAB_00147a73;
          lVar40 = 0;
          do {
            if (auStack_c80[lVar40] != puVar32[lVar40]) goto LAB_00147ae6;
            lVar40 = lVar40 + 1;
          } while (lVar40 != 0x40);
        }
        musig_tweak_test_helper
                  ((secp256k1_xonly_pubkey *)psVar34,auStack_d10,auStack_d10 + 0x20,
                   (secp256k1_musig_keyagg_cache *)auStack_b30);
        lVar20 = lVar20 + 1;
        puVar32 = puVar32 + 0x40;
      } while (lVar20 != 9);
      iVar14 = iVar14 + 1;
    } while (iVar14 < COUNT);
  }
  auStack_700._0_8_ = (uchar *)0xc8fff302b399d5e0;
  auStack_700._8_8_ = 0x7c5b7f16badac71;
  auStack_700._16_8_ = 0x2a72ecf89701e2ef;
  auStack_700._24_8_ = 0xab148a38201a4c7b;
  uStack_6a0 = 0x40;
  secp256k1_sha256_initialize_tagged((secp256k1_sha256 *)auStack_940,(uchar *)"KeyAgg list",0xb);
  test_sha256_eq((secp256k1_sha256 *)auStack_940,(secp256k1_sha256 *)auStack_700);
  auStack_700._0_8_ = (uchar *)0x6a480de6ef02c5a;
  auStack_700._8_8_ = 0x1d1134f21f298665;
  auStack_700._16_8_ = 0x52da414756a0b063;
  auStack_700._24_8_ = 0x4484be15f280d9d4;
  uStack_6a0 = 0x40;
  secp256k1_sha256_initialize_tagged
            ((secp256k1_sha256 *)auStack_940,(uchar *)"KeyAgg coefficient",0x12);
  test_sha256_eq((secp256k1_sha256 *)auStack_940,(secp256k1_sha256 *)auStack_700);
  auStack_700._0_8_ = (uchar *)0xf463fe7ea19e884b;
  auStack_700._8_8_ = 0xbeb0f9ff2f18f9a2;
  auStack_700._16_8_ = 0x6ebd26f0f37e8b0;
  auStack_700._24_8_ = 0x522fb150e3b243d2;
  uStack_6a0 = 0x40;
  secp256k1_sha256_initialize_tagged((secp256k1_sha256 *)auStack_940,(uchar *)"MuSig/aux",9);
  test_sha256_eq((secp256k1_sha256 *)auStack_940,(secp256k1_sha256 *)auStack_700);
  auStack_700._0_8_ = (uchar *)0x1800341407101b64;
  auStack_700._8_8_ = 0xe6258ee0391bc43;
  auStack_700._16_8_ = 0x8343937e29d26b72;
  auStack_700._24_8_ = 0xff568a30b7a0a4fb;
  uStack_6a0 = 0x40;
  secp256k1_sha256_initialize_tagged((secp256k1_sha256 *)auStack_940,(uchar *)"MuSig/nonce",0xb);
  test_sha256_eq((secp256k1_sha256 *)auStack_940,(secp256k1_sha256 *)auStack_700);
  auStack_700._0_8_ = (uchar *)0x6bf7e532c7d5a45;
  auStack_700._8_8_ = (uchar *)0x971254c089be68a6;
  auStack_700._16_8_ = (uchar *)0x72846dcd60ac12d2;
  auStack_700._24_8_ = (uchar *)0xde7a25006c81212f;
  uStack_6a0 = 0x40;
  secp256k1_sha256_initialize_tagged((secp256k1_sha256 *)auStack_940,(uchar *)"MuSig/noncecoef",0xf)
  ;
  test_sha256_eq((secp256k1_sha256 *)auStack_940,(secp256k1_sha256 *)auStack_700);
  lVar20 = 0x197448;
  lVar40 = 0;
  do {
    psVar29 = (secp256k1_keyagg_cache_internal *)auStack_940;
    psVar37 = (secp256k1_keyagg_cache_internal *)auStack_b30;
    iVar14 = musig_vectors_keyagg_and_tweak
                       ((MUSIG_ERROR *)auStack_b30,(secp256k1_musig_keyagg_cache *)psVar29,
                        (uchar *)auStack_700,(uchar (*) [33])&musig_key_agg_vector,
                        musig_key_agg_vector.tweaks,
                        musig_key_agg_vector.valid_case[lVar40].key_indices_len,
                        musig_key_agg_vector.valid_case[lVar40].key_indices,0,(size_t *)0x0,
                        (int *)0x0);
    if (iVar14 == 0) goto LAB_00147a96;
    lVar43 = 0;
    do {
      if (auStack_700[lVar43] != *(char *)(lVar20 + lVar43)) goto LAB_00147bb3;
      lVar43 = lVar43 + 1;
    } while (lVar43 != 0x20);
    lVar40 = lVar40 + 1;
    lVar20 = lVar20 + 0x48;
  } while (lVar40 != 4);
  lVar20 = 0;
  do {
    psVar37 = (secp256k1_keyagg_cache_internal *)auStack_700;
    psVar29 = (secp256k1_keyagg_cache_internal *)auStack_940;
    iVar14 = musig_vectors_keyagg_and_tweak
                       ((MUSIG_ERROR *)psVar37,(secp256k1_musig_keyagg_cache *)auStack_940,
                        (uchar *)0x0,(uchar (*) [33])&musig_key_agg_vector,
                        musig_key_agg_vector.tweaks,
                        *(size_t *)
                         ((long)musig_key_agg_vector.error_case[0].key_indices + lVar20 + -8),
                        (size_t *)((long)musig_key_agg_vector.error_case[0].key_indices + lVar20),
                        *(size_t *)
                         ((long)musig_key_agg_vector.error_case[0].tweak_indices + lVar20 + -8),
                        (size_t *)((long)musig_key_agg_vector.error_case[0].tweak_indices + lVar20),
                        (int *)((long)musig_key_agg_vector.error_case[0].is_xonly + lVar20));
    if (iVar14 != 0) goto LAB_00147aaf;
    if (*(uint32_t *)((long)musig_key_agg_vector.error_case[0].is_xonly + lVar20 + 4) !=
        auStack_700._0_4_) goto LAB_00147ab4;
    lVar20 = lVar20 + 0x40;
  } while (lVar20 != 0x140);
  lVar20 = 0;
  bVar13 = true;
  do {
    bVar30 = bVar13;
    lVar40 = lVar20 * 0x178;
    auStack_c80._0_8_ = *(undefined8 *)musig_nonce_gen_vector.test_case[lVar20].rand_;
    auStack_c80._8_8_ = *(undefined8 *)(musig_nonce_gen_vector.test_case[lVar20].rand_ + 8);
    auStack_c80._16_8_ = *(undefined8 *)(musig_nonce_gen_vector.test_case[lVar20].rand_ + 0x10);
    auStack_c80._24_8_ = *(undefined8 *)(musig_nonce_gen_vector.test_case[lVar20].rand_ + 0x18);
    puVar33 = musig_nonce_gen_vector.test_case[lVar20].sk;
    if (musig_nonce_gen_vector.test_case[lVar20].has_sk == 0) {
      puVar33 = (uchar *)0x0;
    }
    cache = (secp256k1_musig_keyagg_cache *)0x0;
    if (musig_nonce_gen_vector.test_case[lVar20].has_aggpk != 0) {
      memset((secp256k1_keyagg_cache_internal *)auStack_940,0,0x118);
      psVar29 = (secp256k1_keyagg_cache_internal *)auStack_b30;
      psVar37 = (secp256k1_keyagg_cache_internal *)CTX;
      iVar14 = secp256k1_xonly_pubkey_parse
                         (CTX,(secp256k1_xonly_pubkey *)auStack_b30,
                          musig_nonce_gen_vector.test_case[lVar20].aggpk);
      if (iVar14 == 0) goto LAB_00147adc;
      psVar29 = (secp256k1_keyagg_cache_internal *)auStack_940;
      psVar37 = (secp256k1_keyagg_cache_internal *)CTX;
      iVar14 = secp256k1_pubkey_load
                         (CTX,(secp256k1_ge *)auStack_940,(secp256k1_pubkey *)auStack_b30);
      if (iVar14 == 0) goto LAB_00147ae1;
      cache = (secp256k1_musig_keyagg_cache *)auStack_700;
      secp256k1_keyagg_cache_save(cache,(secp256k1_keyagg_cache_internal *)auStack_940);
    }
    iVar14 = musig_nonce_gen_vector.test_case[lVar20].has_msg;
    iVar18 = musig_nonce_gen_vector.test_case[lVar20].has_extra_in;
    psVar29 = (secp256k1_keyagg_cache_internal *)auStack_d10;
    psVar37 = (secp256k1_keyagg_cache_internal *)CTX;
    iVar19 = secp256k1_ec_pubkey_parse
                       (CTX,(secp256k1_pubkey *)auStack_d10,
                        musig_nonce_gen_vector.test_case[lVar20].pk,0x21);
    if (iVar19 == 0) goto LAB_00147ac3;
    extra_input32 = musig_nonce_gen_vector.test_case[lVar20].extra_in;
    if (iVar18 == 0) {
      extra_input32 = (uchar *)0x0;
    }
    msg32 = musig_nonce_gen_vector.test_case[lVar20].msg;
    if (iVar14 == 0) {
      msg32 = (uchar *)0x0;
    }
    psVar29 = (secp256k1_keyagg_cache_internal *)auStack_940;
    psVar37 = (secp256k1_keyagg_cache_internal *)CTX;
    iVar14 = secp256k1_musig_nonce_gen
                       (CTX,(secp256k1_musig_secnonce *)psVar29,
                        (secp256k1_musig_pubnonce *)auStack_b30,auStack_c80,puVar33,
                        (secp256k1_pubkey *)auStack_d10,msg32,cache,extra_input32);
    if (iVar14 != 1) goto LAB_00147ac8;
    lVar20 = 0;
    do {
      if (auStack_940[lVar20 + 4] != *(char *)(lVar40 + 0x197754 + lVar20)) goto LAB_00147bb8;
      lVar20 = lVar20 + 1;
    } while (lVar20 != 0x40);
    lVar20 = 0;
    do {
      if (auStack_900[lVar20 + 4] != auStack_d10[lVar20]) goto LAB_00147bbd;
      lVar20 = lVar20 + 1;
    } while (lVar20 != 0x40);
    lVar20 = -0x21;
    do {
      if (*(char *)(lVar40 + 0x1977b5 + lVar20) != *(char *)(lVar40 + 0x1976e5 + lVar20))
      goto LAB_00147bc2;
      lVar20 = lVar20 + 1;
    } while (lVar20 != 0);
    psVar29 = (secp256k1_keyagg_cache_internal *)auStack_a60;
    psVar37 = (secp256k1_keyagg_cache_internal *)CTX;
    iVar14 = secp256k1_musig_pubnonce_serialize
                       (CTX,(uchar *)psVar29,(secp256k1_musig_pubnonce *)auStack_b30);
    if (iVar14 == 0) goto LAB_00147acd;
    lVar20 = 0;
    do {
      if (auStack_a60[lVar20] != *(char *)(lVar40 + 0x1977b5 + lVar20)) goto LAB_00147bc7;
      lVar20 = lVar20 + 1;
    } while (lVar20 != 0x42);
    lVar20 = 1;
    bVar13 = false;
  } while (bVar30);
  lVar20 = 0;
  bVar13 = true;
  do {
    bVar30 = bVar13;
    puVar21 = (undefined8 *)auStack_a60;
    lVar40 = 0;
    psVar24 = (secp256k1_keyagg_cache_internal *)auStack_940;
    bVar13 = true;
    do {
      bVar10 = bVar13;
      psVar29 = psVar24;
      psVar37 = (secp256k1_keyagg_cache_internal *)CTX;
      iVar14 = secp256k1_musig_pubnonce_parse
                         (CTX,(secp256k1_musig_pubnonce *)psVar24,
                          musig_nonce_agg_vector.pnonces
                          [*(long *)(lVar20 * 0x58 + 0x197b40 + lVar40 * 8)]);
      if (iVar14 == 0) goto LAB_00147a5a;
      *puVar21 = psVar24;
      lVar40 = 1;
      puVar21 = (undefined8 *)(auStack_a60 + 8);
      psVar24 = (secp256k1_keyagg_cache_internal *)auStack_8bc;
      bVar13 = false;
    } while (bVar10);
    psVar29 = (secp256k1_keyagg_cache_internal *)auStack_700;
    psVar37 = (secp256k1_keyagg_cache_internal *)CTX;
    iVar14 = secp256k1_musig_nonce_agg
                       (CTX,(secp256k1_musig_aggnonce *)auStack_700,
                        (secp256k1_musig_pubnonce **)auStack_a60,2);
    if (iVar14 == 0) goto LAB_00147ad2;
    psVar29 = (secp256k1_keyagg_cache_internal *)auStack_b30;
    psVar37 = (secp256k1_keyagg_cache_internal *)CTX;
    iVar14 = secp256k1_musig_aggnonce_serialize
                       (CTX,(uchar *)psVar29,(secp256k1_musig_aggnonce *)auStack_700);
    if (iVar14 == 0) goto LAB_00147ad7;
    lVar40 = 0;
    do {
      if (auStack_b30[lVar40] != *(char *)(lVar20 * 0x58 + 0x197b50 + lVar40)) goto LAB_00147bcc;
      lVar40 = lVar40 + 1;
    } while (lVar40 != 0x21);
    lVar20 = 1;
    bVar13 = false;
  } while (bVar30);
  lVar20 = 0;
  do {
    uVar26 = musig_nonce_agg_vector.error_case[lVar20].invalid_nonce_idx;
    uVar48 = 0;
    psVar29 = (secp256k1_keyagg_cache_internal *)auStack_940;
    bVar13 = true;
    do {
      bVar30 = bVar13;
      psVar37 = (secp256k1_keyagg_cache_internal *)CTX;
      uVar17 = secp256k1_musig_pubnonce_parse
                         (CTX,(secp256k1_musig_pubnonce *)psVar29,
                          musig_nonce_agg_vector.pnonces
                          [*(long *)(lVar20 * 0x58 + 0x197bf0 + uVar48 * 8)]);
      if (uVar17 != (uVar48 != uVar26)) goto LAB_00147a5f;
      uVar48 = 1;
      psVar29 = psStack_d48;
      bVar13 = false;
    } while (bVar30);
    lVar20 = lVar20 + 1;
  } while (lVar20 != 3);
  lVar20 = 0x198490;
  lVar40 = 0;
  do {
    psVar29 = (secp256k1_keyagg_cache_internal *)auStack_c80;
    psVar37 = (secp256k1_keyagg_cache_internal *)CTX;
    iVar14 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)psVar29,musig_sign_verify_vector.sk);
    if (iVar14 == 0) goto LAB_00147af5;
    psVar37 = (secp256k1_keyagg_cache_internal *)auStack_9a0;
    psVar29 = (secp256k1_keyagg_cache_internal *)auStack_940;
    iVar14 = musig_vectors_keyagg_and_tweak
                       ((MUSIG_ERROR *)psVar37,(secp256k1_musig_keyagg_cache *)auStack_940,
                        (uchar *)0x0,musig_sign_verify_vector.pubkeys,(uchar (*) [32])0x0,
                        musig_sign_verify_vector.valid_case[lVar40].key_indices_len,
                        musig_sign_verify_vector.valid_case[lVar40].key_indices,0,(size_t *)0x0,
                        (int *)0x0);
    if (iVar14 == 0) goto LAB_00147afa;
    psVar29 = (secp256k1_keyagg_cache_internal *)auStack_a60;
    psVar37 = (secp256k1_keyagg_cache_internal *)CTX;
    iVar14 = secp256k1_musig_aggnonce_parse
                       (CTX,(secp256k1_musig_aggnonce *)auStack_a60,
                        musig_sign_verify_vector.aggnonces
                        [musig_sign_verify_vector.valid_case[lVar40].aggnonce_index]);
    if (iVar14 == 0) goto LAB_00147aff;
    psVar29 = (secp256k1_keyagg_cache_internal *)auStack_700;
    psVar37 = (secp256k1_keyagg_cache_internal *)CTX;
    iVar14 = secp256k1_musig_nonce_process
                       (CTX,(secp256k1_musig_session *)psVar29,
                        (secp256k1_musig_aggnonce *)auStack_a60,
                        musig_sign_verify_vector.msgs
                        [musig_sign_verify_vector.valid_case[lVar40].msg_index],
                        (secp256k1_musig_keyagg_cache *)auStack_940);
    if (iVar14 == 0) goto LAB_00147b04;
    psVar29 = (secp256k1_keyagg_cache_internal *)auStack_bb0;
    psVar37 = (secp256k1_keyagg_cache_internal *)CTX;
    iVar14 = secp256k1_ec_pubkey_parse
                       (CTX,(secp256k1_pubkey *)auStack_bb0,musig_sign_verify_vector.pubkeys[0],0x21
                       );
    if (iVar14 == 0) goto LAB_00147b09;
    musig_test_set_secnonce
              ((secp256k1_musig_secnonce *)auStack_d10,musig_sign_verify_vector.secnonces[0],
               (secp256k1_pubkey *)auStack_bb0);
    psVar29 = (secp256k1_keyagg_cache_internal *)auStack_db0;
    psVar37 = (secp256k1_keyagg_cache_internal *)CTX;
    iVar14 = secp256k1_musig_partial_sign
                       (CTX,(secp256k1_musig_partial_sig *)auStack_db0,
                        (secp256k1_musig_secnonce *)auStack_d10,(secp256k1_keypair *)auStack_c80,
                        (secp256k1_musig_keyagg_cache *)auStack_940,
                        (secp256k1_musig_session *)auStack_700);
    if (iVar14 == 0) goto LAB_00147b0e;
    psVar29 = (secp256k1_keyagg_cache_internal *)(auStack_c80 + 0x90);
    psVar37 = (secp256k1_keyagg_cache_internal *)CTX;
    iVar14 = secp256k1_musig_partial_sig_serialize
                       (CTX,(uchar *)psVar29,(secp256k1_musig_partial_sig *)auStack_db0);
    if (iVar14 == 0) goto LAB_00147b13;
    lVar43 = 0;
    do {
      psVar24 = psVar29;
      if (auStack_c80[lVar43 + 0x90] != *(char *)(lVar20 + lVar43)) goto LAB_00147be5;
      lVar43 = lVar43 + 1;
    } while (lVar43 != 0x20);
    psVar29 = (secp256k1_keyagg_cache_internal *)auStack_b30;
    psVar37 = (secp256k1_keyagg_cache_internal *)CTX;
    iVar14 = secp256k1_musig_pubnonce_parse
                       (CTX,(secp256k1_musig_pubnonce *)auStack_b30,
                        musig_sign_verify_vector.pubnonces[0]);
    if (iVar14 == 0) goto LAB_00147b18;
    psVar29 = (secp256k1_keyagg_cache_internal *)auStack_db0;
    psVar37 = (secp256k1_keyagg_cache_internal *)CTX;
    iVar14 = secp256k1_musig_partial_sig_verify
                       (CTX,(secp256k1_musig_partial_sig *)psVar29,
                        (secp256k1_musig_pubnonce *)auStack_b30,(secp256k1_pubkey *)auStack_bb0,
                        (secp256k1_musig_keyagg_cache *)auStack_940,
                        (secp256k1_musig_session *)auStack_700);
    if (iVar14 == 0) goto LAB_00147b1d;
    lVar40 = lVar40 + 1;
    lVar20 = lVar20 + 0x58;
  } while (lVar40 != 4);
  lVar20 = 0;
  do {
    if (lVar20 != 0) {
      iVar14 = *(int *)((long)musig_sign_verify_vector.sign_error_case[0].key_indices +
                       lVar20 + 0x30);
      psVar29 = (secp256k1_keyagg_cache_internal *)auStack_940;
      psVar37 = (secp256k1_keyagg_cache_internal *)(auStack_c80 + 0x90);
      uVar26 = musig_vectors_keyagg_and_tweak
                         ((MUSIG_ERROR *)(auStack_c80 + 0x90),
                          (secp256k1_musig_keyagg_cache *)psVar29,(uchar *)0x0,
                          musig_sign_verify_vector.pubkeys,(uchar (*) [32])0x0,
                          *(size_t *)
                           ((long)musig_sign_verify_vector.sign_error_case[0].key_indices +
                           lVar20 + -8),
                          (size_t *)
                          ((long)musig_sign_verify_vector.sign_error_case[0].key_indices + lVar20),0
                          ,(size_t *)0x0,(int *)0x0);
      if (uVar26 != (iVar14 != 0)) goto LAB_00147b27;
      if (iVar14 == 0) {
        psVar24 = psVar29;
        if (auStack_c80._144_4_ != 0) goto LAB_00147b9f;
      }
      else {
        psVar29 = (secp256k1_keyagg_cache_internal *)auStack_b30;
        psVar37 = (secp256k1_keyagg_cache_internal *)CTX;
        uVar26 = secp256k1_musig_aggnonce_parse
                           (CTX,(secp256k1_musig_aggnonce *)psVar29,
                            musig_sign_verify_vector.aggnonces
                            [*(long *)((long)musig_sign_verify_vector.sign_error_case[0].key_indices
                                      + lVar20 + 0x18)]);
        psVar24 = psVar29;
        if (uVar26 != (iVar14 != 3)) goto LAB_00147b6d;
        if (iVar14 != 3) {
          psVar24 = (secp256k1_keyagg_cache_internal *)auStack_700;
          psVar37 = (secp256k1_keyagg_cache_internal *)CTX;
          iVar18 = secp256k1_musig_nonce_process
                             (CTX,(secp256k1_musig_session *)psVar24,
                              (secp256k1_musig_aggnonce *)auStack_b30,
                              musig_sign_verify_vector.msgs
                              [*(long *)((long)musig_sign_verify_vector.sign_error_case[0].
                                               key_indices + lVar20 + 0x20)],
                              (secp256k1_musig_keyagg_cache *)auStack_940);
          if (iVar18 == 0) goto LAB_00147ba9;
          psVar24 = (secp256k1_keyagg_cache_internal *)auStack_c80;
          psVar37 = (secp256k1_keyagg_cache_internal *)CTX;
          iVar18 = secp256k1_ec_pubkey_parse
                             (CTX,(secp256k1_pubkey *)auStack_c80,
                              musig_sign_verify_vector.pubkeys[0],0x21);
          if (iVar18 == 0) goto LAB_00147bae;
          psVar29 = (secp256k1_keyagg_cache_internal *)
                    (musig_sign_verify_vector.secnonces +
                    *(long *)((long)musig_sign_verify_vector.sign_error_case[0].key_indices +
                             lVar20 + 0x28));
          musig_test_set_secnonce
                    ((secp256k1_musig_secnonce *)auStack_a60,(uchar *)psVar29,
                     (secp256k1_pubkey *)auStack_c80);
          psVar37 = (secp256k1_keyagg_cache_internal *)CTX;
          if (iVar14 == 4) {
            auStack_9a0._0_4_ = 0;
            auStack_db0._0_8_ = (CTX->illegal_callback).fn;
            auStack_db0._8_8_ = (CTX->illegal_callback).data;
            if (CTX == &secp256k1_context_static_) goto LAB_00147bd1;
            (CTX->illegal_callback).fn = counting_callback_fn;
            (((secp256k1_context *)psVar37)->illegal_callback).data = auStack_9a0;
            psVar29 = (secp256k1_keyagg_cache_internal *)auStack_bb0;
            iVar14 = secp256k1_musig_partial_sign
                               ((secp256k1_context *)psVar37,(secp256k1_musig_partial_sig *)psVar29,
                                (secp256k1_musig_secnonce *)auStack_a60,
                                (secp256k1_keypair *)auStack_d10,
                                (secp256k1_musig_keyagg_cache *)auStack_940,
                                (secp256k1_musig_session *)auStack_700);
            psVar27 = CTX;
            if (iVar14 != 0) goto LAB_00147bdb;
            (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)auStack_db0._0_8_;
            (psVar27->illegal_callback).data = (void *)auStack_db0._8_8_;
            if (auStack_9a0._0_4_ != 1) goto LAB_00147be0;
          }
          else {
            psVar29 = (secp256k1_keyagg_cache_internal *)auStack_bb0;
            iVar14 = secp256k1_musig_partial_sign
                               (CTX,(secp256k1_musig_partial_sig *)psVar29,
                                (secp256k1_musig_secnonce *)auStack_a60,
                                (secp256k1_keypair *)auStack_d10,
                                (secp256k1_musig_keyagg_cache *)auStack_940,
                                (secp256k1_musig_session *)auStack_700);
            if (iVar14 == 0) goto LAB_00147bd6;
          }
        }
      }
    }
    lVar20 = lVar20 + 0x40;
  } while (lVar20 != 0x180);
  lVar20 = 0x198780;
  lVar40 = 0;
  do {
    uVar48 = musig_sign_verify_vector.verify_fail_case[lVar40].nonce_indices_len;
    if (uVar48 < 3) goto LAB_00147b22;
    psVar24 = (secp256k1_keyagg_cache_internal *)auStack_940;
    uVar22 = 0;
    do {
      psVar29 = psVar24;
      psVar37 = (secp256k1_keyagg_cache_internal *)CTX;
      iVar14 = secp256k1_musig_pubnonce_parse
                         (CTX,(secp256k1_musig_pubnonce *)psVar24,
                          musig_sign_verify_vector.pubnonces[*(long *)(lVar20 + uVar22 * 8)]);
      if (iVar14 == 0) goto LAB_00147a78;
      *(secp256k1_keyagg_cache_internal **)(auStack_bb0 + uVar22 * 8) = psVar24;
      uVar22 = uVar22 + 1;
      psVar24 = (secp256k1_keyagg_cache_internal *)((long)(psVar24->second_pk).x.n + 0x1c);
    } while (uVar48 != uVar22);
    psVar37 = (secp256k1_keyagg_cache_internal *)auStack_db0;
    psVar29 = (secp256k1_keyagg_cache_internal *)auStack_700;
    iVar14 = musig_vectors_keyagg_and_tweak
                       ((MUSIG_ERROR *)psVar37,(secp256k1_musig_keyagg_cache *)psVar29,(uchar *)0x0,
                        musig_sign_verify_vector.pubkeys,(uchar (*) [32])0x0,
                        musig_sign_verify_vector.verify_fail_case[lVar40].key_indices_len,
                        musig_sign_verify_vector.verify_fail_case[lVar40].key_indices,0,
                        (size_t *)0x0,(int *)0x0);
    if (iVar14 == 0) goto LAB_00147b2c;
    psVar29 = (secp256k1_keyagg_cache_internal *)auStack_a60;
    psVar37 = (secp256k1_keyagg_cache_internal *)CTX;
    iVar14 = secp256k1_musig_nonce_agg
                       (CTX,(secp256k1_musig_aggnonce *)auStack_a60,
                        (secp256k1_musig_pubnonce **)auStack_bb0,uVar48);
    if (iVar14 == 0) goto LAB_00147b31;
    psVar29 = (secp256k1_keyagg_cache_internal *)auStack_b30;
    psVar37 = (secp256k1_keyagg_cache_internal *)CTX;
    iVar14 = secp256k1_musig_nonce_process
                       (CTX,(secp256k1_musig_session *)psVar29,
                        (secp256k1_musig_aggnonce *)auStack_a60,
                        musig_sign_verify_vector.msgs
                        [musig_sign_verify_vector.verify_fail_case[lVar40].msg_index],
                        (secp256k1_musig_keyagg_cache *)auStack_700);
    if (iVar14 == 0) goto LAB_00147b36;
    psVar29 = (secp256k1_keyagg_cache_internal *)auStack_d10;
    psVar37 = (secp256k1_keyagg_cache_internal *)CTX;
    iVar14 = secp256k1_ec_pubkey_parse
                       (CTX,(secp256k1_pubkey *)psVar29,
                        musig_sign_verify_vector.pubkeys
                        [musig_sign_verify_vector.verify_fail_case[lVar40].signer_index],0x21);
    if (iVar14 == 0) goto LAB_00147b3b;
    MVar2 = musig_sign_verify_vector.verify_fail_case[lVar40].error;
    psVar29 = (secp256k1_keyagg_cache_internal *)auStack_c80;
    psVar37 = (secp256k1_keyagg_cache_internal *)CTX;
    uVar26 = secp256k1_musig_partial_sig_parse
                       (CTX,(secp256k1_musig_partial_sig *)psVar29,
                        musig_sign_verify_vector.verify_fail_case[lVar40].sig);
    psVar24 = psVar29;
    if (uVar26 != (MVar2 != MUSIG_SIG)) goto LAB_00147b40;
    if (MVar2 != MUSIG_SIG) {
      psVar29 = (secp256k1_keyagg_cache_internal *)auStack_c80;
      psVar37 = (secp256k1_keyagg_cache_internal *)CTX;
      uVar26 = secp256k1_musig_partial_sig_verify
                         (CTX,(secp256k1_musig_partial_sig *)psVar29,
                          (secp256k1_musig_pubnonce *)auStack_940,(secp256k1_pubkey *)auStack_d10,
                          (secp256k1_musig_keyagg_cache *)auStack_700,
                          (secp256k1_musig_session *)auStack_b30);
      if (uVar26 != (MVar2 != MUSIG_SIG_VERIFY)) goto LAB_00147b9a;
    }
    lVar40 = lVar40 + 1;
    lVar20 = lVar20 + 0x78;
  } while (lVar40 != 3);
  lVar20 = 0;
  bVar13 = true;
  do {
    bVar30 = bVar13;
    MVar2 = musig_sign_verify_vector.verify_error_case[lVar20].error;
    psVar37 = (secp256k1_keyagg_cache_internal *)auStack_b30;
    psVar24 = (secp256k1_keyagg_cache_internal *)auStack_940;
    uVar26 = musig_vectors_keyagg_and_tweak
                       ((MUSIG_ERROR *)psVar37,(secp256k1_musig_keyagg_cache *)auStack_940,
                        (uchar *)0x0,musig_sign_verify_vector.pubkeys,(uchar (*) [32])0x0,
                        musig_sign_verify_vector.verify_error_case[lVar20].key_indices_len,
                        musig_sign_verify_vector.verify_error_case[lVar20].key_indices,0,
                        (size_t *)0x0,(int *)0x0);
    if (uVar26 != (MVar2 != MUSIG_PUBKEY)) goto LAB_00147b45;
    if (MVar2 == MUSIG_PUBKEY) {
      if (auStack_b30._0_4_ != 0) goto LAB_00147ba4;
    }
    else {
      psVar29 = (secp256k1_keyagg_cache_internal *)auStack_700;
      psVar37 = (secp256k1_keyagg_cache_internal *)CTX;
      uVar26 = secp256k1_musig_pubnonce_parse
                         (CTX,(secp256k1_musig_pubnonce *)psVar29,
                          musig_sign_verify_vector.pubnonces
                          [*(long *)(lVar20 * 0x78 + 0x1988e8 +
                                    musig_sign_verify_vector.verify_error_case[lVar20].signer_index
                                    * 8)]);
      if (uVar26 != (MVar2 != MUSIG_PUBNONCE)) goto LAB_00147b90;
    }
    lVar20 = 1;
    bVar13 = false;
  } while (bVar30);
  psVar24 = (secp256k1_keyagg_cache_internal *)auStack_b30;
  psVar37 = (secp256k1_keyagg_cache_internal *)CTX;
  iVar14 = secp256k1_musig_aggnonce_parse
                     (CTX,(secp256k1_musig_aggnonce *)psVar24,musig_tweak_vector.aggnonce);
  if (iVar14 == 0) {
LAB_00147bf4:
    run_musig_tests_cold_64();
LAB_00147bf9:
    run_musig_tests_cold_63();
LAB_00147bfe:
    run_musig_tests_cold_38();
LAB_00147c03:
    run_musig_tests_cold_39();
LAB_00147c08:
    run_musig_tests_cold_49();
LAB_00147c0d:
    run_musig_tests_cold_48();
LAB_00147c12:
    run_musig_tests_cold_47();
  }
  else {
    psVar24 = (secp256k1_keyagg_cache_internal *)auStack_bb0;
    psVar37 = (secp256k1_keyagg_cache_internal *)CTX;
    iVar14 = secp256k1_ec_pubkey_parse
                       (CTX,(secp256k1_pubkey *)psVar24,musig_tweak_vector.pubkeys[0],0x21);
    if (iVar14 == 0) goto LAB_00147bf9;
    lVar40 = 0x198e40;
    lVar20 = 0;
    do {
      musig_test_set_secnonce
                ((secp256k1_musig_secnonce *)auStack_a60,musig_tweak_vector.secnonce,
                 (secp256k1_pubkey *)auStack_bb0);
      psVar24 = (secp256k1_keyagg_cache_internal *)auStack_c80;
      psVar37 = (secp256k1_keyagg_cache_internal *)CTX;
      iVar14 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)psVar24,musig_tweak_vector.sk);
      if (iVar14 == 0) goto LAB_00147b4a;
      psVar37 = (secp256k1_keyagg_cache_internal *)auStack_9a0;
      psVar24 = (secp256k1_keyagg_cache_internal *)auStack_940;
      iVar14 = musig_vectors_keyagg_and_tweak
                         ((MUSIG_ERROR *)psVar37,(secp256k1_musig_keyagg_cache *)auStack_940,
                          (uchar *)0x0,musig_tweak_vector.pubkeys,musig_tweak_vector.tweaks,
                          musig_tweak_vector.valid_case[lVar20].key_indices_len,
                          musig_tweak_vector.valid_case[lVar20].key_indices,
                          musig_tweak_vector.valid_case[lVar20].tweak_indices_len,
                          musig_tweak_vector.valid_case[lVar20].tweak_indices,
                          musig_tweak_vector.valid_case[lVar20].is_xonly);
      if (iVar14 == 0) goto LAB_00147b4f;
      psVar24 = (secp256k1_keyagg_cache_internal *)auStack_700;
      psVar37 = (secp256k1_keyagg_cache_internal *)CTX;
      iVar14 = secp256k1_musig_nonce_process
                         (CTX,(secp256k1_musig_session *)auStack_700,
                          (secp256k1_musig_aggnonce *)auStack_b30,musig_tweak_vector.msg,
                          (secp256k1_musig_keyagg_cache *)auStack_940);
      if (iVar14 == 0) goto LAB_00147b54;
      psVar29 = (secp256k1_keyagg_cache_internal *)auStack_db0;
      psVar24 = psVar29;
      psVar37 = (secp256k1_keyagg_cache_internal *)CTX;
      iVar14 = secp256k1_musig_partial_sign
                         (CTX,(secp256k1_musig_partial_sig *)psVar29,
                          (secp256k1_musig_secnonce *)auStack_a60,(secp256k1_keypair *)auStack_c80,
                          (secp256k1_musig_keyagg_cache *)auStack_940,
                          (secp256k1_musig_session *)auStack_700);
      if (iVar14 == 0) goto LAB_00147b59;
      psVar24 = (secp256k1_keyagg_cache_internal *)(auStack_c80 + 0x90);
      psVar37 = (secp256k1_keyagg_cache_internal *)CTX;
      iVar14 = secp256k1_musig_partial_sig_serialize
                         (CTX,(uchar *)psVar24,(secp256k1_musig_partial_sig *)psVar29);
      if (iVar14 == 0) goto LAB_00147b5e;
      lVar43 = 0;
      do {
        if (auStack_c80[lVar43 + 0x90] != *(char *)(lVar40 + lVar43)) goto LAB_00147bea;
        lVar43 = lVar43 + 1;
      } while (lVar43 != 0x20);
      psVar24 = (secp256k1_keyagg_cache_internal *)auStack_d10;
      psVar37 = (secp256k1_keyagg_cache_internal *)CTX;
      iVar14 = secp256k1_musig_pubnonce_parse
                         (CTX,(secp256k1_musig_pubnonce *)auStack_d10,
                          musig_tweak_vector.pubnonces
                          [*(long *)(lVar20 * 0xa0 + 0x198de8 +
                                    musig_tweak_vector.valid_case[lVar20].signer_index * 8)]);
      if (iVar14 == 0) goto LAB_00147b63;
      psVar37 = (secp256k1_keyagg_cache_internal *)CTX;
      iVar14 = secp256k1_musig_partial_sig_verify
                         (CTX,(secp256k1_musig_partial_sig *)psVar29,
                          (secp256k1_musig_pubnonce *)auStack_d10,(secp256k1_pubkey *)auStack_bb0,
                          (secp256k1_musig_keyagg_cache *)auStack_940,
                          (secp256k1_musig_session *)auStack_700);
      if (iVar14 == 0) goto LAB_00147b68;
      lVar20 = lVar20 + 1;
      lVar40 = lVar40 + 0xa0;
    } while (lVar20 != 5);
    psVar37 = (secp256k1_keyagg_cache_internal *)auStack_700;
    psVar24 = (secp256k1_keyagg_cache_internal *)auStack_940;
    iVar14 = musig_vectors_keyagg_and_tweak
                       ((MUSIG_ERROR *)psVar37,(secp256k1_musig_keyagg_cache *)psVar24,(uchar *)0x0,
                        musig_tweak_vector.pubkeys,musig_tweak_vector.tweaks,3,
                        musig_tweak_vector.error_case[0].key_indices,1,
                        musig_tweak_vector.error_case[0].tweak_indices,
                        musig_tweak_vector.error_case[0].is_xonly);
    if (iVar14 != 0) goto LAB_00147bfe;
    if (auStack_700._0_4_ != 1) goto LAB_00147c03;
    lVar20 = 0x199438;
    lVar40 = 0x199448;
    lVar43 = 0;
    do {
      psVar37 = (secp256k1_keyagg_cache_internal *)(auStack_c80 + 0x90);
      psVar24 = (secp256k1_keyagg_cache_internal *)auStack_700;
      iVar14 = musig_vectors_keyagg_and_tweak
                         ((MUSIG_ERROR *)psVar37,(secp256k1_musig_keyagg_cache *)auStack_700,
                          auStack_db0,(uchar (*) [33])&musig_sig_agg_vector,
                          musig_sig_agg_vector.tweaks,
                          musig_sig_agg_vector.valid_case[lVar43].key_indices_len,
                          musig_sig_agg_vector.valid_case[lVar43].key_indices,
                          musig_sig_agg_vector.valid_case[lVar43].tweak_indices_len,
                          musig_sig_agg_vector.valid_case[lVar43].tweak_indices,
                          musig_sig_agg_vector.valid_case[lVar43].is_xonly);
      if (iVar14 == 0) goto LAB_00147b72;
      psVar24 = (secp256k1_keyagg_cache_internal *)auStack_a60;
      psVar37 = (secp256k1_keyagg_cache_internal *)CTX;
      iVar14 = secp256k1_musig_aggnonce_parse
                         (CTX,(secp256k1_musig_aggnonce *)auStack_a60,
                          musig_sig_agg_vector.valid_case[lVar43].aggnonce);
      if (iVar14 == 0) goto LAB_00147b77;
      psVar24 = (secp256k1_keyagg_cache_internal *)auStack_b30;
      psVar37 = (secp256k1_keyagg_cache_internal *)CTX;
      iVar14 = secp256k1_musig_nonce_process
                         (CTX,(secp256k1_musig_session *)psVar24,
                          (secp256k1_musig_aggnonce *)auStack_a60,musig_sig_agg_vector.msg,
                          (secp256k1_musig_keyagg_cache *)auStack_700);
      if (iVar14 == 0) goto LAB_00147b7c;
      n_sigs = musig_sig_agg_vector.valid_case[lVar43].psig_indices_len;
      if (n_sigs != 0) {
        psVar29 = (secp256k1_keyagg_cache_internal *)auStack_940;
        sVar44 = 0;
        do {
          psVar24 = psVar29;
          psVar37 = (secp256k1_keyagg_cache_internal *)CTX;
          iVar14 = secp256k1_musig_partial_sig_parse
                             (CTX,(secp256k1_musig_partial_sig *)psVar29,
                              musig_sig_agg_vector.psigs[*(long *)(lVar20 + sVar44 * 8)]);
          if (iVar14 == 0) goto LAB_00147a8c;
          *(secp256k1_keyagg_cache_internal **)(auStack_d10 + sVar44 * 8) = psVar29;
          sVar44 = sVar44 + 1;
          psVar29 = (secp256k1_keyagg_cache_internal *)
                    ((long)(((secp256k1_ecmult_gen_context *)&psVar29->pk)->scalar_offset).d + 0x1c)
          ;
        } while (n_sigs != sVar44);
      }
      psVar29 = (secp256k1_keyagg_cache_internal *)auStack_c80;
      psVar24 = psVar29;
      psVar37 = (secp256k1_keyagg_cache_internal *)CTX;
      iVar14 = secp256k1_musig_partial_sig_agg
                         (CTX,(uchar *)psVar29,(secp256k1_musig_session *)auStack_b30,
                          (secp256k1_musig_partial_sig **)auStack_d10,n_sigs);
      if (iVar14 != 1) goto LAB_00147b81;
      lVar23 = 0;
      do {
        if (auStack_c80[lVar23] != *(char *)(lVar40 + lVar23)) goto LAB_00147bef;
        lVar23 = lVar23 + 1;
      } while (lVar23 != 0x40);
      psVar24 = (secp256k1_keyagg_cache_internal *)auStack_bb0;
      psVar37 = (secp256k1_keyagg_cache_internal *)CTX;
      iVar14 = secp256k1_xonly_pubkey_parse(CTX,(secp256k1_xonly_pubkey *)auStack_bb0,auStack_db0);
      if (iVar14 == 0) goto LAB_00147b86;
      psVar37 = (secp256k1_keyagg_cache_internal *)CTX;
      iVar14 = secp256k1_schnorrsig_verify
                         (CTX,(uchar *)psVar29,musig_sig_agg_vector.msg,0x20,
                          (secp256k1_xonly_pubkey *)auStack_bb0);
      if (iVar14 == 0) goto LAB_00147b8b;
      lVar43 = lVar43 + 1;
      lVar20 = lVar20 + 0xe8;
      lVar40 = lVar40 + 0xe8;
    } while (lVar43 != 4);
    psVar29 = (secp256k1_keyagg_cache_internal *)auStack_940;
    lVar20 = 0;
    bVar13 = true;
    do {
      bVar30 = bVar13;
      psVar37 = (secp256k1_keyagg_cache_internal *)CTX;
      iVar14 = secp256k1_musig_partial_sig_parse
                         (CTX,(secp256k1_musig_partial_sig *)psVar29,
                          musig_sig_agg_vector.psigs
                          [musig_sig_agg_vector.error_case[0].psig_indices[lVar20]]);
      if (iVar14 == (int)lVar20) goto LAB_00147b95;
      lVar20 = 1;
      psVar29 = (secp256k1_keyagg_cache_internal *)auStack_91c;
      bVar13 = false;
    } while (bVar30);
    auStack_c80._16_8_ = 0xa7966cfe594a463d;
    auStack_c80._24_8_ = 0x54ef5a7cf071e8ef;
    auStack_c80._0_8_ = (secp256k1_musig_pubnonce *)0xc554721b7dcbc1ee;
    auStack_c80._8_8_ = (void *)0x642eb01ac6d9b0ca;
    psVar24 = (secp256k1_keyagg_cache_internal *)auStack_b30;
    psVar37 = (secp256k1_keyagg_cache_internal *)CTX;
    iVar14 = secp256k1_keypair_create(CTX,(secp256k1_keypair *)psVar24,auStack_c80);
    if (iVar14 == 0) goto LAB_00147c08;
    psVar24 = (secp256k1_keyagg_cache_internal *)auStack_d10;
    psVar37 = (secp256k1_keyagg_cache_internal *)CTX;
    iVar14 = secp256k1_keypair_pub(CTX,(secp256k1_pubkey *)psVar24,(secp256k1_keypair *)auStack_b30)
    ;
    if (iVar14 == 0) goto LAB_00147c0d;
    psVar24 = (secp256k1_keyagg_cache_internal *)auStack_940;
    psVar37 = (secp256k1_keyagg_cache_internal *)CTX;
    iVar14 = secp256k1_musig_nonce_gen_counter
                       (CTX,(secp256k1_musig_secnonce *)psVar24,
                        (secp256k1_musig_pubnonce *)auStack_700,0,(secp256k1_keypair *)auStack_b30,
                        (uchar *)0x0,(secp256k1_musig_keyagg_cache *)0x0,(uchar *)0x0);
    if (iVar14 == 0) goto LAB_00147c12;
    lVar20 = 0;
    do {
      if (auStack_940[lVar20 + 4] != (&DAT_00199830)[lVar20]) goto LAB_00147c1c;
      lVar20 = lVar20 + 1;
    } while (lVar20 != 0x40);
    lVar20 = 0;
    do {
      if (auStack_900[lVar20 + 4] != auStack_d10[lVar20]) goto LAB_00147c21;
      lVar20 = lVar20 + 1;
    } while (lVar20 != 0x40);
    psVar24 = (secp256k1_keyagg_cache_internal *)auStack_a60;
    psVar37 = (secp256k1_keyagg_cache_internal *)CTX;
    iVar14 = secp256k1_musig_pubnonce_serialize
                       (CTX,(uchar *)psVar24,(secp256k1_musig_pubnonce *)auStack_700);
    if (iVar14 != 0) {
      lVar20 = 0;
      while (auStack_a60[lVar20] == (&DAT_00199870)[lVar20]) {
        lVar20 = lVar20 + 1;
        if (lVar20 == 0x42) {
          return;
        }
      }
      goto LAB_00147c26;
    }
  }
  run_musig_tests_cold_46();
LAB_00147c1c:
  run_musig_tests_cold_43();
LAB_00147c21:
  run_musig_tests_cold_44();
LAB_00147c26:
  run_musig_tests_cold_45();
  secp256k1_fe_verify((secp256k1_fe *)psVar24);
  secp256k1_fe_verify(a);
  *(undefined4 *)((((secp256k1_ecmult_gen_context *)&psVar37->pk)->ge_offset).y.n + 1) = 0;
  uVar11 = *(undefined4 *)((long)((psVar24->pk).x.n + 0) + 4);
  uVar42 = (((secp256k1_ecmult_gen_context *)&psVar24->pk)->scalar_offset).d[0];
  uVar3 = (((secp256k1_ecmult_gen_context *)&psVar24->pk)->scalar_offset).d[1];
  uVar4 = (((secp256k1_ecmult_gen_context *)&psVar24->pk)->scalar_offset).d[2];
  uVar5 = (((secp256k1_ecmult_gen_context *)&psVar24->pk)->scalar_offset).d[3];
  uVar6 = (((secp256k1_ecmult_gen_context *)&psVar24->pk)->ge_offset).x.n[0];
  *(int *)((psVar37->pk).x.n + 0) = *(int *)((psVar24->pk).x.n + 0);
  *(undefined4 *)((long)((psVar37->pk).x.n + 0) + 4) = uVar11;
  (((secp256k1_ecmult_gen_context *)&psVar37->pk)->scalar_offset).d[0] = uVar42;
  (((secp256k1_ecmult_gen_context *)&psVar37->pk)->scalar_offset).d[1] = uVar3;
  (((secp256k1_ecmult_gen_context *)&psVar37->pk)->scalar_offset).d[2] = uVar4;
  (((secp256k1_ecmult_gen_context *)&psVar37->pk)->scalar_offset).d[3] = uVar5;
  (((secp256k1_ecmult_gen_context *)&psVar37->pk)->ge_offset).x.n[0] = uVar6;
  uVar42 = a->n[1];
  uVar3 = a->n[2];
  uVar4 = a->n[3];
  uVar11 = *(undefined4 *)(a->n + 4);
  uVar12 = *(undefined4 *)((long)(a->n + 4) + 4);
  uVar5 = *(uint64_t *)&a->magnitude;
  (((secp256k1_ecmult_gen_context *)&psVar37->pk)->ge_offset).x.n[1] = a->n[0];
  (((secp256k1_ecmult_gen_context *)&psVar37->pk)->ge_offset).x.n[2] = uVar42;
  (((secp256k1_ecmult_gen_context *)&psVar37->pk)->ge_offset).x.n[3] = uVar3;
  (((secp256k1_ecmult_gen_context *)&psVar37->pk)->ge_offset).x.n[4] = uVar4;
  *(int *)((psVar37->pk).y.n + 4) = uVar11;
  *(undefined4 *)((long)((psVar37->pk).y.n + 4) + 4) = uVar12;
  (((secp256k1_ecmult_gen_context *)&psVar37->pk)->ge_offset).y.n[0] = uVar5;
  secp256k1_ge_verify(&psVar37->pk);
  return;
}

Assistant:

static void run_schnorrsig_tests(void) {
    int i;
    run_nonce_function_bip340_tests();

    test_schnorrsig_api();
    test_schnorrsig_sha256_tagged();
    test_schnorrsig_bip_vectors();
    for (i = 0; i < COUNT; i++) {
        test_schnorrsig_sign();
        test_schnorrsig_sign_verify();
    }
    test_schnorrsig_taproot();
}